

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  BBox1f BVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  int iVar21;
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar118 [32];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  undefined1 auVar124 [32];
  int iVar126;
  undefined4 uVar127;
  vint4 bi_2;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  vint4 bi_1;
  undefined1 auVar132 [16];
  vint4 bi;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  vfloat4 a0;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar144;
  float fVar151;
  float fVar152;
  vfloat4 b0;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar153;
  vint4 ai;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar162;
  float fVar163;
  vint4 ai_1;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar171;
  float fVar176;
  vint4 ai_2;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  vfloat4 a0_3;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  float fVar201;
  float fVar210;
  float fVar211;
  vfloat4 b0_2;
  undefined1 auVar202 [16];
  float fVar212;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  vfloat4 a0_4;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  undefined1 local_378 [16];
  ulong local_368;
  Primitive *local_360;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  undefined8 local_308;
  undefined8 uStack_300;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_e8 [16];
  undefined1 local_d8 [16];
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar117 [32];
  undefined1 auVar119 [32];
  undefined1 auVar121 [32];
  undefined1 auVar123 [32];
  undefined1 auVar125 [32];
  float fVar143;
  float fVar150;
  float fVar154;
  float fVar161;
  float fVar164;
  float fVar170;
  
  uVar24 = (ulong)(byte)prim[1];
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 4 + 6)));
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 5 + 6)));
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 6 + 6)));
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0xf + 6)));
  lVar29 = uVar24 * 0x25;
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x11 + 6)));
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x1a + 6)));
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x1b + 6)));
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x1c + 6)));
  auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(prim + lVar29 + 0x12)));
  auVar51 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar51 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar37 = vsubps_avx512vl(auVar51,*(undefined1 (*) [16])(prim + lVar29 + 6));
  fVar163 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar29 + 0x16)) *
            *(float *)(prim + lVar29 + 0x1a);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar24 * 7 + 6);
  auVar71 = vpmovsxwd_avx(auVar51);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar24 * 0xb + 6);
  auVar55 = vpmovsxwd_avx(auVar54);
  auVar38 = vpbroadcastd_avx512vl();
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar24 * 9 + 6);
  auVar39 = vpmovsxwd_avx512vl(auVar53);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar24 * 0xd + 6);
  auVar40 = vpmovsxwd_avx512vl(auVar52);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar24 * 0x12 + 6);
  auVar58 = vpmovsxwd_avx(auVar58);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar24 * 0x16 + 6);
  auVar57 = vpmovsxwd_avx(auVar57);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar24 * 0x14 + 6);
  auVar59 = vpmovsxwd_avx(auVar59);
  auVar51 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar51 = vinsertps_avx512f(auVar51,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar37 = vmulps_avx512vl(auVar36,auVar37);
  auVar36 = vmulps_avx512vl(auVar36,auVar51);
  auVar41 = vcvtdq2ps_avx512vl(auVar47);
  auVar42 = vcvtdq2ps_avx512vl(auVar42);
  auVar43 = vcvtdq2ps_avx512vl(auVar43);
  auVar44 = vcvtdq2ps_avx512vl(auVar44);
  auVar45 = vcvtdq2ps_avx512vl(auVar45);
  auVar51 = vcvtdq2ps_avx(auVar46);
  auVar54 = vcvtdq2ps_avx(auVar48);
  auVar53 = vcvtdq2ps_avx(auVar49);
  auVar52 = vcvtdq2ps_avx(auVar50);
  auVar46 = vbroadcastss_avx512vl(auVar36);
  auVar47 = vshufps_avx512vl(auVar36,auVar36,0x55);
  auVar48 = vshufps_avx512vl(auVar36,auVar36,0xaa);
  auVar49 = vmulps_avx512vl(auVar48,auVar43);
  auVar62._0_4_ = auVar48._0_4_ * auVar51._0_4_;
  auVar62._4_4_ = auVar48._4_4_ * auVar51._4_4_;
  auVar62._8_4_ = auVar48._8_4_ * auVar51._8_4_;
  auVar62._12_4_ = auVar48._12_4_ * auVar51._12_4_;
  auVar36._0_4_ = auVar52._0_4_ * auVar48._0_4_;
  auVar36._4_4_ = auVar52._4_4_ * auVar48._4_4_;
  auVar36._8_4_ = auVar52._8_4_ * auVar48._8_4_;
  auVar36._12_4_ = auVar52._12_4_ * auVar48._12_4_;
  auVar48 = vfmadd231ps_avx512vl(auVar49,auVar47,auVar42);
  auVar49 = vfmadd231ps_avx512vl(auVar62,auVar47,auVar45);
  auVar47 = vfmadd231ps_fma(auVar36,auVar53,auVar47);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar46,auVar41);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar46,auVar44);
  auVar47 = vfmadd231ps_fma(auVar47,auVar54,auVar46);
  auVar46 = vbroadcastss_avx512vl(auVar37);
  auVar50 = vshufps_avx512vl(auVar37,auVar37,0x55);
  auVar36 = vshufps_avx512vl(auVar37,auVar37,0xaa);
  auVar246 = ZEXT1664(auVar36);
  auVar43 = vmulps_avx512vl(auVar36,auVar43);
  auVar51 = vmulps_avx512vl(auVar36,auVar51);
  auVar52 = vmulps_avx512vl(auVar36,auVar52);
  auVar42 = vfmadd231ps_avx512vl(auVar43,auVar50,auVar42);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar50,auVar45);
  auVar53 = vfmadd231ps_avx512vl(auVar52,auVar50,auVar53);
  auVar37 = vfmadd231ps_avx512vl(auVar42,auVar46,auVar41);
  auVar41 = vfmadd231ps_avx512vl(auVar51,auVar46,auVar44);
  auVar36 = vfmadd231ps_fma(auVar53,auVar46,auVar54);
  auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar250 = ZEXT1664(auVar51);
  auVar54 = vandps_avx512vl(auVar48,auVar51);
  auVar65._8_4_ = 0x219392ef;
  auVar65._0_8_ = 0x219392ef219392ef;
  auVar65._12_4_ = 0x219392ef;
  uVar30 = vcmpps_avx512vl(auVar54,auVar65,1);
  bVar33 = (bool)((byte)uVar30 & 1);
  auVar56._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar48._0_4_;
  bVar33 = (bool)((byte)(uVar30 >> 1) & 1);
  auVar56._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar48._4_4_;
  bVar33 = (bool)((byte)(uVar30 >> 2) & 1);
  auVar56._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar48._8_4_;
  bVar33 = (bool)((byte)(uVar30 >> 3) & 1);
  auVar56._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar48._12_4_;
  auVar54 = vandps_avx512vl(auVar49,auVar51);
  uVar30 = vcmpps_avx512vl(auVar54,auVar65,1);
  bVar33 = (bool)((byte)uVar30 & 1);
  auVar60._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar49._0_4_;
  bVar33 = (bool)((byte)(uVar30 >> 1) & 1);
  auVar60._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar49._4_4_;
  bVar33 = (bool)((byte)(uVar30 >> 2) & 1);
  auVar60._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar49._8_4_;
  bVar33 = (bool)((byte)(uVar30 >> 3) & 1);
  auVar60._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar49._12_4_;
  auVar51 = vandps_avx512vl(auVar47,auVar51);
  uVar30 = vcmpps_avx512vl(auVar51,auVar65,1);
  bVar33 = (bool)((byte)uVar30 & 1);
  auVar61._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar47._0_4_;
  bVar33 = (bool)((byte)(uVar30 >> 1) & 1);
  auVar61._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar47._4_4_;
  bVar33 = (bool)((byte)(uVar30 >> 2) & 1);
  auVar61._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar47._8_4_;
  bVar33 = (bool)((byte)(uVar30 >> 3) & 1);
  auVar61._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar47._12_4_;
  auVar54 = vrcp14ps_avx512vl(auVar56);
  auVar66._8_4_ = 0x3f800000;
  auVar66._0_8_ = 0x3f8000003f800000;
  auVar66._12_4_ = 0x3f800000;
  auVar51 = vfnmadd213ps_fma(auVar56,auVar54,auVar66);
  auVar52 = vfmadd132ps_fma(auVar51,auVar54,auVar54);
  auVar54 = vrcp14ps_avx512vl(auVar60);
  auVar51 = vfnmadd213ps_fma(auVar60,auVar54,auVar66);
  auVar46 = vfmadd132ps_fma(auVar51,auVar54,auVar54);
  auVar54 = vrcp14ps_avx512vl(auVar61);
  auVar51 = vfnmadd213ps_fma(auVar61,auVar54,auVar66);
  auVar48 = vfmadd132ps_fma(auVar51,auVar54,auVar54);
  auVar63._4_4_ = fVar163;
  auVar63._0_4_ = fVar163;
  auVar63._8_4_ = fVar163;
  auVar63._12_4_ = fVar163;
  auVar51 = vcvtdq2ps_avx(auVar71);
  auVar54 = vcvtdq2ps_avx(auVar55);
  auVar54 = vsubps_avx(auVar54,auVar51);
  auVar49 = vfmadd213ps_fma(auVar54,auVar63,auVar51);
  auVar54 = vcvtdq2ps_avx512vl(auVar39);
  auVar51 = vcvtdq2ps_avx512vl(auVar40);
  auVar51 = vsubps_avx(auVar51,auVar54);
  auVar50 = vfmadd213ps_fma(auVar51,auVar63,auVar54);
  auVar51 = vcvtdq2ps_avx(auVar58);
  auVar54 = vcvtdq2ps_avx(auVar57);
  auVar54 = vsubps_avx(auVar54,auVar51);
  auVar58 = vfmadd213ps_fma(auVar54,auVar63,auVar51);
  auVar51 = vcvtdq2ps_avx(auVar59);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar24 * 0x18 + 6);
  auVar54 = vpmovsxwd_avx(auVar47);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar53 = vsubps_avx(auVar54,auVar51);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar24 * 0x1d + 6);
  auVar54 = vpmovsxwd_avx(auVar42);
  auVar53 = vfmadd213ps_fma(auVar53,auVar63,auVar51);
  auVar51 = vcvtdq2ps_avx(auVar54);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar24 * 0x21 + 6);
  auVar54 = vpmovsxwd_avx(auVar43);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar54 = vsubps_avx(auVar54,auVar51);
  auVar57 = vfmadd213ps_fma(auVar54,auVar63,auVar51);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar24 * 0x1f + 6);
  auVar51 = vpmovsxwd_avx(auVar44);
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar24 * 0x23 + 6);
  auVar54 = vpmovsxwd_avx(auVar45);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar54 = vsubps_avx(auVar54,auVar51);
  auVar54 = vfmadd213ps_fma(auVar54,auVar63,auVar51);
  auVar51 = vsubps_avx512vl(auVar49,auVar37);
  auVar39._0_4_ = auVar52._0_4_ * auVar51._0_4_;
  auVar39._4_4_ = auVar52._4_4_ * auVar51._4_4_;
  auVar39._8_4_ = auVar52._8_4_ * auVar51._8_4_;
  auVar39._12_4_ = auVar52._12_4_ * auVar51._12_4_;
  auVar51 = vsubps_avx512vl(auVar50,auVar37);
  auVar37._0_4_ = auVar52._0_4_ * auVar51._0_4_;
  auVar37._4_4_ = auVar52._4_4_ * auVar51._4_4_;
  auVar37._8_4_ = auVar52._8_4_ * auVar51._8_4_;
  auVar37._12_4_ = auVar52._12_4_ * auVar51._12_4_;
  auVar51 = vsubps_avx(auVar58,auVar41);
  auVar64._0_4_ = auVar46._0_4_ * auVar51._0_4_;
  auVar64._4_4_ = auVar46._4_4_ * auVar51._4_4_;
  auVar64._8_4_ = auVar46._8_4_ * auVar51._8_4_;
  auVar64._12_4_ = auVar46._12_4_ * auVar51._12_4_;
  auVar51 = vsubps_avx(auVar53,auVar41);
  auVar55._0_4_ = auVar46._0_4_ * auVar51._0_4_;
  auVar55._4_4_ = auVar46._4_4_ * auVar51._4_4_;
  auVar55._8_4_ = auVar46._8_4_ * auVar51._8_4_;
  auVar55._12_4_ = auVar46._12_4_ * auVar51._12_4_;
  auVar51 = vsubps_avx(auVar57,auVar36);
  auVar41._0_4_ = auVar48._0_4_ * auVar51._0_4_;
  auVar41._4_4_ = auVar48._4_4_ * auVar51._4_4_;
  auVar41._8_4_ = auVar48._8_4_ * auVar51._8_4_;
  auVar41._12_4_ = auVar48._12_4_ * auVar51._12_4_;
  auVar51 = vsubps_avx(auVar54,auVar36);
  auVar71._0_4_ = auVar48._0_4_ * auVar51._0_4_;
  auVar71._4_4_ = auVar48._4_4_ * auVar51._4_4_;
  auVar71._8_4_ = auVar48._8_4_ * auVar51._8_4_;
  auVar71._12_4_ = auVar48._12_4_ * auVar51._12_4_;
  auVar51 = vpminsd_avx(auVar39,auVar37);
  auVar54 = vpminsd_avx(auVar64,auVar55);
  auVar51 = vmaxps_avx(auVar51,auVar54);
  auVar54 = vpminsd_avx(auVar41,auVar71);
  uVar127 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar46._4_4_ = uVar127;
  auVar46._0_4_ = uVar127;
  auVar46._8_4_ = uVar127;
  auVar46._12_4_ = uVar127;
  auVar54 = vmaxps_avx512vl(auVar54,auVar46);
  auVar51 = vmaxps_avx(auVar51,auVar54);
  auVar48._8_4_ = 0x3f7ffffa;
  auVar48._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar48._12_4_ = 0x3f7ffffa;
  auVar53 = vmulps_avx512vl(auVar51,auVar48);
  auVar51 = vpmaxsd_avx(auVar39,auVar37);
  auVar54 = vpmaxsd_avx(auVar64,auVar55);
  auVar51 = vminps_avx(auVar51,auVar54);
  auVar54 = vpmaxsd_avx(auVar41,auVar71);
  uVar127 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar49._4_4_ = uVar127;
  auVar49._0_4_ = uVar127;
  auVar49._8_4_ = uVar127;
  auVar49._12_4_ = uVar127;
  auVar54 = vminps_avx512vl(auVar54,auVar49);
  auVar51 = vminps_avx(auVar51,auVar54);
  auVar50._8_4_ = 0x3f800003;
  auVar50._0_8_ = 0x3f8000033f800003;
  auVar50._12_4_ = 0x3f800003;
  auVar51 = vmulps_avx512vl(auVar51,auVar50);
  uVar14 = vcmpps_avx512vl(auVar53,auVar51,2);
  uVar15 = vpcmpgtd_avx512vl(auVar38,_DAT_01f4ad30);
  uVar30 = (ulong)((byte)uVar14 & 0xf & (byte)uVar15);
  auVar51 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar54 = vpxord_avx512vl(auVar40,auVar40);
  auVar245 = ZEXT1664(auVar54);
  auVar54 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar249 = ZEXT1664(auVar54);
  local_360 = prim;
LAB_018bc099:
  if (uVar30 == 0) {
    return;
  }
  lVar29 = 0;
  for (uVar24 = uVar30; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
    lVar29 = lVar29 + 1;
  }
  uVar24 = (ulong)*(uint *)(local_360 + 2);
  pGVar8 = (context->scene->geometries).items[uVar24].ptr;
  fVar163 = (pGVar8->time_range).lower;
  fVar163 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar163) / ((pGVar8->time_range).upper - fVar163));
  auVar54 = vroundss_avx(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),9);
  uVar6 = *(uint *)(local_360 + lVar29 * 4 + 6);
  auVar52 = vaddss_avx512f(ZEXT416((uint)pGVar8->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar54 = vminss_avx(auVar54,auVar52);
  auVar55 = vmaxss_avx512f(auVar245._0_16_,auVar54);
  uVar25 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)uVar6 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar27 = (long)(int)auVar55._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar27);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar27);
  auVar54 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar25);
  lVar29 = uVar25 + 1;
  auVar52 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar29);
  lVar1 = uVar25 + 2;
  auVar58 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar25 + 3;
  auVar57 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar27);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar27);
  auVar59 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar25);
  auVar47 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar29);
  auVar42 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar43 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar27);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar27);
  auVar44 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar25);
  auVar45 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar29);
  auVar46 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar48 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)(lVar10 + 0x38 + lVar27);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar27);
  auVar49 = *(undefined1 (*) [16])(lVar11 + uVar25 * lVar10);
  auVar50 = *(undefined1 (*) [16])(lVar11 + lVar29 * lVar10);
  auVar71 = *(undefined1 (*) [16])(lVar11 + lVar1 * lVar10);
  auVar37 = vsubss_avx512f(ZEXT416((uint)fVar163),auVar55);
  auVar67._0_12_ = ZEXT812(0);
  auVar67._12_4_ = 0;
  auVar55 = vmulps_avx512vl(auVar57,auVar67);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar58,auVar67);
  auVar36 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar52,auVar55);
  auVar38 = vaddps_avx512vl(auVar54,auVar36);
  auVar62 = auVar249._0_16_;
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar52,auVar62);
  auVar39 = vfnmadd231ps_avx512vl(auVar55,auVar54,auVar62);
  auVar75._0_4_ = auVar43._0_4_ * 0.0;
  auVar75._4_4_ = auVar43._4_4_ * 0.0;
  auVar75._8_4_ = auVar43._8_4_ * 0.0;
  auVar75._12_4_ = auVar43._12_4_ * 0.0;
  auVar55 = vfmadd231ps_fma(auVar75,auVar42,auVar67);
  auVar36 = vxorps_avx512vl(auVar246._0_16_,auVar246._0_16_);
  auVar36 = vfmadd213ps_avx512vl(auVar36,auVar47,auVar55);
  auVar40 = vaddps_avx512vl(auVar59,auVar36);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar47,auVar62);
  auVar41 = vfnmadd231ps_avx512vl(auVar55,auVar59,auVar62);
  auVar55 = vxorps_avx512vl(auVar36,auVar36);
  auVar55 = vfmadd213ps_avx512vl(auVar55,auVar58,auVar57);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar52,auVar67);
  auVar56 = vfmadd231ps_avx512vl(auVar55,auVar54,auVar67);
  auVar57 = vmulps_avx512vl(auVar57,auVar62);
  auVar58 = vfnmadd231ps_avx512vl(auVar57,auVar62,auVar58);
  auVar52 = vfmadd231ps_fma(auVar58,auVar67,auVar52);
  auVar36 = vfnmadd231ps_fma(auVar52,auVar67,auVar54);
  auVar54 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar42,auVar43);
  auVar54 = vfmadd231ps_fma(auVar54,auVar47,auVar67);
  auVar55 = vfmadd231ps_fma(auVar54,auVar59,auVar67);
  auVar54 = vmulps_avx512vl(auVar43,auVar62);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar62,auVar42);
  auVar54 = vfmadd231ps_fma(auVar54,auVar67,auVar47);
  auVar47 = vfnmadd231ps_fma(auVar54,auVar67,auVar59);
  auVar52 = vshufps_avx512vl(auVar39,auVar39,0xc9);
  auVar54 = vshufps_avx512vl(auVar40,auVar40,0xc9);
  auVar54 = vmulps_avx512vl(auVar39,auVar54);
  auVar54 = vfmsub231ps_avx512vl(auVar54,auVar52,auVar40);
  auVar58 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar54 = vmulps_avx512vl(auVar39,auVar54);
  auVar54 = vfmsub231ps_fma(auVar54,auVar52,auVar41);
  auVar57 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar52 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar85._0_4_ = auVar36._0_4_ * auVar52._0_4_;
  auVar85._4_4_ = auVar36._4_4_ * auVar52._4_4_;
  auVar85._8_4_ = auVar36._8_4_ * auVar52._8_4_;
  auVar85._12_4_ = auVar36._12_4_ * auVar52._12_4_;
  auVar52 = vfmsub231ps_fma(auVar85,auVar54,auVar55);
  auVar59 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar52 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar91._0_4_ = auVar36._0_4_ * auVar52._0_4_;
  auVar91._4_4_ = auVar36._4_4_ * auVar52._4_4_;
  auVar91._8_4_ = auVar36._8_4_ * auVar52._8_4_;
  auVar91._12_4_ = auVar36._12_4_ * auVar52._12_4_;
  auVar54 = vfmsub231ps_fma(auVar91,auVar54,auVar47);
  auVar47 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vdpps_avx(auVar58,auVar58,0x7f);
  auVar52 = vrsqrt14ss_avx512f(auVar67,ZEXT416(auVar54._0_4_));
  auVar42 = vmulss_avx512f(auVar52,ZEXT416(0x3fc00000));
  auVar43 = vmulss_avx512f(auVar54,ZEXT416(0x3f000000));
  auVar43 = vmulss_avx512f(auVar43,auVar52);
  auVar52 = vmulss_avx512f(auVar43,ZEXT416((uint)(auVar52._0_4_ * auVar52._0_4_)));
  fVar215 = auVar42._0_4_ - auVar52._0_4_;
  auVar177._4_4_ = fVar215;
  auVar177._0_4_ = fVar215;
  auVar177._8_4_ = fVar215;
  auVar177._12_4_ = fVar215;
  auVar52 = vdpps_avx(auVar58,auVar57,0x7f);
  auVar42 = vmulps_avx512vl(auVar58,auVar177);
  auVar43 = vbroadcastss_avx512vl(auVar54);
  auVar57 = vmulps_avx512vl(auVar43,auVar57);
  fVar163 = auVar52._0_4_;
  auVar80._0_4_ = fVar163 * auVar58._0_4_;
  auVar80._4_4_ = fVar163 * auVar58._4_4_;
  auVar80._8_4_ = fVar163 * auVar58._8_4_;
  auVar80._12_4_ = fVar163 * auVar58._12_4_;
  auVar58 = vsubps_avx(auVar57,auVar80);
  auVar52 = vrcp14ss_avx512f(auVar67,ZEXT416(auVar54._0_4_));
  auVar54 = vfnmadd213ss_avx512f(auVar54,auVar52,ZEXT416(0x40000000));
  fVar163 = auVar52._0_4_ * auVar54._0_4_;
  auVar54 = vdpps_avx(auVar59,auVar59,0x7f);
  auVar52 = vrsqrt14ss_avx512f(auVar67,ZEXT416(auVar54._0_4_));
  auVar57 = vmulss_avx512f(auVar52,ZEXT416(0x3fc00000));
  auVar43 = vmulss_avx512f(auVar54,ZEXT416(0x3f000000));
  fVar162 = auVar52._0_4_;
  fVar201 = auVar57._0_4_ - auVar43._0_4_ * fVar162 * fVar162 * fVar162;
  auVar81._0_4_ = auVar59._0_4_ * fVar201;
  auVar81._4_4_ = auVar59._4_4_ * fVar201;
  auVar81._8_4_ = auVar59._8_4_ * fVar201;
  auVar81._12_4_ = auVar59._12_4_ * fVar201;
  auVar52 = vdpps_avx(auVar59,auVar47,0x7f);
  auVar57 = vbroadcastss_avx512vl(auVar54);
  auVar57 = vmulps_avx512vl(auVar57,auVar47);
  fVar162 = auVar52._0_4_;
  auVar40._0_4_ = fVar162 * auVar59._0_4_;
  auVar40._4_4_ = fVar162 * auVar59._4_4_;
  auVar40._8_4_ = fVar162 * auVar59._8_4_;
  auVar40._12_4_ = fVar162 * auVar59._12_4_;
  auVar52 = vsubps_avx(auVar57,auVar40);
  auVar57 = vrcp14ss_avx512f(auVar67,ZEXT416(auVar54._0_4_));
  auVar54 = vfnmadd213ss_avx512f(auVar54,auVar57,ZEXT416(0x40000000));
  fVar162 = auVar57._0_4_ * auVar54._0_4_;
  auVar54 = vshufps_avx512vl(auVar38,auVar38,0xff);
  auVar57 = vmulps_avx512vl(auVar54,auVar42);
  auVar43 = vsubps_avx512vl(auVar38,auVar57);
  auVar59 = vshufps_avx512vl(auVar39,auVar39,0xff);
  auVar59 = vmulps_avx512vl(auVar59,auVar42);
  auVar76._0_4_ = auVar59._0_4_ + auVar54._0_4_ * fVar215 * fVar163 * auVar58._0_4_;
  auVar76._4_4_ = auVar59._4_4_ + auVar54._4_4_ * fVar215 * fVar163 * auVar58._4_4_;
  auVar76._8_4_ = auVar59._8_4_ + auVar54._8_4_ * fVar215 * fVar163 * auVar58._8_4_;
  auVar76._12_4_ = auVar59._12_4_ + auVar54._12_4_ * fVar215 * fVar163 * auVar58._12_4_;
  auVar58 = vsubps_avx512vl(auVar39,auVar76);
  auVar55 = vaddps_avx512vl(auVar38,auVar57);
  auVar57 = vaddps_avx512vl(auVar39,auVar76);
  auVar54 = vshufps_avx512vl(auVar56,auVar56,0xff);
  auVar59 = vmulps_avx512vl(auVar54,auVar81);
  auVar38 = vsubps_avx512vl(auVar56,auVar59);
  auVar47 = vshufps_avx512vl(auVar36,auVar36,0xff);
  auVar42 = vmulps_avx512vl(auVar47,auVar81);
  auVar82._0_4_ = auVar42._0_4_ + auVar54._0_4_ * fVar201 * auVar52._0_4_ * fVar162;
  auVar82._4_4_ = auVar42._4_4_ + auVar54._4_4_ * fVar201 * auVar52._4_4_ * fVar162;
  auVar82._8_4_ = auVar42._8_4_ + auVar54._8_4_ * fVar201 * auVar52._8_4_ * fVar162;
  auVar82._12_4_ = auVar42._12_4_ + auVar54._12_4_ * fVar201 * auVar52._12_4_ * fVar162;
  auVar54 = vsubps_avx(auVar36,auVar82);
  auVar39 = vaddps_avx512vl(auVar56,auVar59);
  auVar59 = vaddps_avx512vl(auVar36,auVar82);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar52 = vmulps_avx512vl(auVar58,auVar36);
  auVar92._0_4_ = auVar43._0_4_ + auVar52._0_4_;
  auVar92._4_4_ = auVar43._4_4_ + auVar52._4_4_;
  auVar92._8_4_ = auVar43._8_4_ + auVar52._8_4_;
  auVar92._12_4_ = auVar43._12_4_ + auVar52._12_4_;
  auVar54 = vmulps_avx512vl(auVar54,auVar36);
  auVar42 = vsubps_avx(auVar38,auVar54);
  auVar54 = vmulps_avx512vl(auVar57,auVar36);
  auVar40 = vaddps_avx512vl(auVar55,auVar54);
  auVar54 = vmulps_avx512vl(auVar59,auVar36);
  auVar41 = vsubps_avx512vl(auVar39,auVar54);
  auVar54 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
  auVar52 = vmulps_avx512vl(auVar48,auVar67);
  auVar52 = vfmadd231ps_fma(auVar52,auVar46,auVar67);
  auVar58 = vxorps_avx512vl(auVar59,auVar59);
  auVar58 = vfmadd213ps_avx512vl(auVar58,auVar45,auVar52);
  auVar56 = vaddps_avx512vl(auVar44,auVar58);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar45,auVar62);
  auVar60 = vfnmadd231ps_avx512vl(auVar52,auVar44,auVar62);
  auVar52 = vmulps_avx512vl(auVar54,auVar67);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar71,auVar67);
  auVar58 = vxorps_avx512vl(auVar47,auVar47);
  auVar58 = vfmadd213ps_avx512vl(auVar58,auVar50,auVar52);
  auVar57 = vaddps_avx512vl(auVar49,auVar58);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar50,auVar62);
  auVar59 = vfnmadd231ps_avx512vl(auVar52,auVar49,auVar62);
  auVar52 = vxorps_avx512vl(auVar58,auVar58);
  auVar52 = vfmadd213ps_avx512vl(auVar52,auVar46,auVar48);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar45,auVar67);
  auVar61 = vfmadd231ps_avx512vl(auVar52,auVar44,auVar67);
  auVar52 = vmulps_avx512vl(auVar48,auVar62);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar62,auVar46);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar67,auVar45);
  auVar44 = vfnmadd231ps_avx512vl(auVar52,auVar67,auVar44);
  auVar52 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar71,auVar54);
  auVar52 = vfmadd231ps_fma(auVar52,auVar50,auVar67);
  auVar52 = vfmadd231ps_fma(auVar52,auVar49,auVar67);
  auVar54 = vmulps_avx512vl(auVar54,auVar62);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar62,auVar71);
  auVar54 = vfmadd231ps_fma(auVar54,auVar67,auVar50);
  auVar47 = vfnmadd231ps_fma(auVar54,auVar67,auVar49);
  auVar54 = vshufps_avx(auVar60,auVar60,0xc9);
  auVar58 = vshufps_avx512vl(auVar57,auVar57,0xc9);
  fVar201 = auVar60._0_4_;
  auVar216._0_4_ = fVar201 * auVar58._0_4_;
  fVar210 = auVar60._4_4_;
  auVar216._4_4_ = fVar210 * auVar58._4_4_;
  fVar211 = auVar60._8_4_;
  auVar216._8_4_ = fVar211 * auVar58._8_4_;
  fVar143 = auVar60._12_4_;
  auVar216._12_4_ = fVar143 * auVar58._12_4_;
  auVar58 = vfmsub231ps_avx512vl(auVar216,auVar54,auVar57);
  auVar58 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar57 = vshufps_avx512vl(auVar59,auVar59,0xc9);
  auVar225._0_4_ = fVar201 * auVar57._0_4_;
  auVar225._4_4_ = fVar210 * auVar57._4_4_;
  auVar225._8_4_ = fVar211 * auVar57._8_4_;
  auVar225._12_4_ = fVar143 * auVar57._12_4_;
  auVar54 = vfmsub231ps_avx512vl(auVar225,auVar54,auVar59);
  auVar57 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar45 = vshufps_avx512vl(auVar44,auVar44,0xc9);
  auVar54 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar54 = vmulps_avx512vl(auVar44,auVar54);
  auVar54 = vfmsub231ps_fma(auVar54,auVar45,auVar52);
  auVar59 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar52 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar54 = vdpps_avx(auVar58,auVar58,0x7f);
  auVar52 = vmulps_avx512vl(auVar44,auVar52);
  auVar52 = vfmsub231ps_fma(auVar52,auVar45,auVar47);
  auVar47 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar52 = vrsqrt14ss_avx512f(auVar67,ZEXT416(auVar54._0_4_));
  auVar45 = vmulss_avx512f(auVar52,ZEXT416(0x3fc00000));
  auVar46 = vmulss_avx512f(auVar54,ZEXT416(0x3f000000));
  auVar46 = vmulss_avx512f(auVar46,auVar52);
  auVar52 = vmulss_avx512f(auVar46,ZEXT416((uint)(auVar52._0_4_ * auVar52._0_4_)));
  auVar52 = vsubss_avx512f(auVar45,auVar52);
  auVar238._0_4_ = auVar52._0_4_;
  auVar238._4_4_ = auVar238._0_4_;
  auVar238._8_4_ = auVar238._0_4_;
  auVar238._12_4_ = auVar238._0_4_;
  auVar45 = vmulps_avx512vl(auVar58,auVar238);
  auVar52 = vdpps_avx(auVar58,auVar57,0x7f);
  auVar46 = vbroadcastss_avx512vl(auVar54);
  auVar57 = vmulps_avx512vl(auVar46,auVar57);
  fVar163 = auVar52._0_4_;
  auVar88._0_4_ = auVar58._0_4_ * fVar163;
  auVar88._4_4_ = auVar58._4_4_ * fVar163;
  auVar88._8_4_ = auVar58._8_4_ * fVar163;
  auVar88._12_4_ = auVar58._12_4_ * fVar163;
  auVar58 = vsubps_avx(auVar57,auVar88);
  auVar52 = vrcp14ss_avx512f(auVar67,ZEXT416(auVar54._0_4_));
  auVar54 = vfnmadd213ss_avx512f(auVar54,auVar52,ZEXT416(0x40000000));
  fVar163 = auVar52._0_4_ * auVar54._0_4_;
  auVar54 = vdpps_avx(auVar59,auVar59,0x7f);
  auVar52 = vrsqrt14ss_avx512f(auVar67,ZEXT416(auVar54._0_4_));
  auVar57 = vmulss_avx512f(auVar52,ZEXT416(0x3fc00000));
  auVar46 = vmulss_avx512f(auVar54,ZEXT416(0x3f000000));
  fVar162 = auVar52._0_4_;
  fVar215 = auVar57._0_4_ - auVar46._0_4_ * fVar162 * fVar162 * fVar162;
  auVar233._0_4_ = auVar59._0_4_ * fVar215;
  auVar233._4_4_ = auVar59._4_4_ * fVar215;
  auVar233._8_4_ = auVar59._8_4_ * fVar215;
  auVar233._12_4_ = auVar59._12_4_ * fVar215;
  auVar52 = vdpps_avx(auVar59,auVar47,0x7f);
  auVar57 = vbroadcastss_avx512vl(auVar54);
  auVar57 = vmulps_avx512vl(auVar57,auVar47);
  fVar162 = auVar52._0_4_;
  auVar193._0_4_ = auVar59._0_4_ * fVar162;
  auVar193._4_4_ = auVar59._4_4_ * fVar162;
  auVar193._8_4_ = auVar59._8_4_ * fVar162;
  auVar193._12_4_ = auVar59._12_4_ * fVar162;
  auVar52 = vsubps_avx(auVar57,auVar193);
  auVar57 = vrcp14ss_avx512f(auVar67,ZEXT416(auVar54._0_4_));
  auVar54 = vfnmadd213ss_avx512f(auVar54,auVar57,ZEXT416(0x40000000));
  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  fVar162 = auVar54._0_4_ * auVar57._0_4_;
  auVar57 = vshufps_avx512vl(auVar56,auVar56,0xff);
  auVar59 = vmulps_avx512vl(auVar57,auVar45);
  auVar47 = vsubps_avx512vl(auVar56,auVar59);
  auVar54 = vshufps_avx(auVar60,auVar60,0xff);
  auVar54 = vmulps_avx512vl(auVar54,auVar45);
  auVar77._0_4_ = auVar54._0_4_ + auVar57._0_4_ * auVar238._0_4_ * fVar163 * auVar58._0_4_;
  auVar77._4_4_ = auVar54._4_4_ + auVar57._4_4_ * auVar238._0_4_ * fVar163 * auVar58._4_4_;
  auVar77._8_4_ = auVar54._8_4_ + auVar57._8_4_ * auVar238._0_4_ * fVar163 * auVar58._8_4_;
  auVar77._12_4_ = auVar54._12_4_ + auVar57._12_4_ * auVar238._0_4_ * fVar163 * auVar58._12_4_;
  auVar54 = vsubps_avx(auVar60,auVar77);
  auVar58 = vaddps_avx512vl(auVar56,auVar59);
  auVar78._0_4_ = fVar201 + auVar77._0_4_;
  auVar78._4_4_ = fVar210 + auVar77._4_4_;
  auVar78._8_4_ = fVar211 + auVar77._8_4_;
  auVar78._12_4_ = fVar143 + auVar77._12_4_;
  auVar57 = vshufps_avx512vl(auVar61,auVar61,0xff);
  auVar226._0_4_ = auVar57._0_4_ * auVar233._0_4_;
  auVar226._4_4_ = auVar57._4_4_ * auVar233._4_4_;
  auVar226._8_4_ = auVar57._8_4_ * auVar233._8_4_;
  auVar226._12_4_ = auVar57._12_4_ * auVar233._12_4_;
  auVar59 = vsubps_avx512vl(auVar61,auVar226);
  auVar45 = vshufps_avx512vl(auVar44,auVar44,0xff);
  auVar45 = vmulps_avx512vl(auVar45,auVar233);
  auVar83._0_4_ = auVar45._0_4_ + auVar57._0_4_ * fVar215 * auVar52._0_4_ * fVar162;
  auVar83._4_4_ = auVar45._4_4_ + auVar57._4_4_ * fVar215 * auVar52._4_4_ * fVar162;
  auVar83._8_4_ = auVar45._8_4_ + auVar57._8_4_ * fVar215 * auVar52._8_4_ * fVar162;
  auVar83._12_4_ = auVar45._12_4_ + auVar57._12_4_ * fVar215 * auVar52._12_4_ * fVar162;
  auVar52 = vsubps_avx512vl(auVar44,auVar83);
  auVar57 = vaddps_avx512vl(auVar61,auVar226);
  auVar44 = vaddps_avx512vl(auVar44,auVar83);
  auVar54 = vmulps_avx512vl(auVar54,auVar36);
  auVar194._0_4_ = auVar47._0_4_ + auVar54._0_4_;
  auVar194._4_4_ = auVar47._4_4_ + auVar54._4_4_;
  auVar194._8_4_ = auVar47._8_4_ + auVar54._8_4_;
  auVar194._12_4_ = auVar47._12_4_ + auVar54._12_4_;
  auVar54 = vmulps_avx512vl(auVar52,auVar36);
  auVar54 = vsubps_avx(auVar59,auVar54);
  auVar52 = vmulps_avx512vl(auVar78,auVar36);
  auVar79._0_4_ = auVar58._0_4_ + auVar52._0_4_;
  auVar79._4_4_ = auVar58._4_4_ + auVar52._4_4_;
  auVar79._8_4_ = auVar58._8_4_ + auVar52._8_4_;
  auVar79._12_4_ = auVar58._12_4_ + auVar52._12_4_;
  auVar52 = vmulps_avx512vl(auVar44,auVar36);
  auVar251 = ZEXT464(0x3f800000);
  auVar52 = vsubps_avx(auVar57,auVar52);
  auVar44 = vbroadcastss_avx512vl(auVar37);
  auVar45 = vsubss_avx512f(ZEXT416(0x3f800000),auVar37);
  auVar68._0_4_ = auVar45._0_4_;
  auVar68._4_4_ = auVar68._0_4_;
  auVar68._8_4_ = auVar68._0_4_;
  auVar68._12_4_ = auVar68._0_4_;
  auVar47 = vmulps_avx512vl(auVar44,auVar47);
  auVar45 = vmulps_avx512vl(auVar44,auVar194);
  auVar54 = vmulps_avx512vl(auVar44,auVar54);
  auVar239._0_4_ = auVar44._0_4_ * auVar59._0_4_;
  auVar239._4_4_ = auVar44._4_4_ * auVar59._4_4_;
  auVar239._8_4_ = auVar44._8_4_ * auVar59._8_4_;
  auVar239._12_4_ = auVar44._12_4_ * auVar59._12_4_;
  auVar56 = vfmadd231ps_avx512vl(auVar47,auVar68,auVar43);
  auVar60 = vfmadd231ps_avx512vl(auVar45,auVar68,auVar92);
  auVar61 = vfmadd231ps_avx512vl(auVar54,auVar68,auVar42);
  auVar45 = vfmadd231ps_fma(auVar239,auVar68,auVar38);
  auVar54 = vmulps_avx512vl(auVar44,auVar58);
  auVar58 = vmulps_avx512vl(auVar44,auVar79);
  auVar52 = vmulps_avx512vl(auVar44,auVar52);
  auVar227._0_4_ = auVar44._0_4_ * auVar57._0_4_;
  auVar227._4_4_ = auVar44._4_4_ * auVar57._4_4_;
  auVar227._8_4_ = auVar44._8_4_ * auVar57._8_4_;
  auVar227._12_4_ = auVar44._12_4_ * auVar57._12_4_;
  auVar63 = vfmadd231ps_avx512vl(auVar54,auVar68,auVar55);
  auVar40 = vfmadd231ps_avx512vl(auVar58,auVar68,auVar40);
  auVar41 = vfmadd231ps_avx512vl(auVar52,auVar68,auVar41);
  auVar46 = vfmadd231ps_fma(auVar227,auVar68,auVar39);
  auVar54 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar54 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar163 = *(float *)(ray + k * 4 + 0x30);
  auVar64 = vsubps_avx512vl(auVar56,auVar54);
  uVar127 = auVar64._0_4_;
  auVar70._4_4_ = uVar127;
  auVar70._0_4_ = uVar127;
  auVar70._8_4_ = uVar127;
  auVar70._12_4_ = uVar127;
  auVar52 = vshufps_avx(auVar64,auVar64,0x55);
  auVar58 = vshufps_avx(auVar64,auVar64,0xaa);
  aVar4 = pre->ray_space[k].vx.field_0;
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar162 = pre->ray_space[k].vz.field_0.m128[0];
  fVar215 = pre->ray_space[k].vz.field_0.m128[1];
  fVar201 = pre->ray_space[k].vz.field_0.m128[2];
  fVar210 = pre->ray_space[k].vz.field_0.m128[3];
  auVar69._0_4_ = fVar162 * auVar58._0_4_;
  auVar69._4_4_ = fVar215 * auVar58._4_4_;
  auVar69._8_4_ = fVar201 * auVar58._8_4_;
  auVar69._12_4_ = fVar210 * auVar58._12_4_;
  auVar52 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar5,auVar52);
  auVar48 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar70);
  auVar65 = vsubps_avx512vl(auVar60,auVar54);
  uVar127 = auVar65._0_4_;
  auVar73._4_4_ = uVar127;
  auVar73._0_4_ = uVar127;
  auVar73._8_4_ = uVar127;
  auVar73._12_4_ = uVar127;
  auVar52 = vshufps_avx(auVar65,auVar65,0x55);
  auVar58 = vshufps_avx(auVar65,auVar65,0xaa);
  auVar72._0_4_ = fVar162 * auVar58._0_4_;
  auVar72._4_4_ = fVar215 * auVar58._4_4_;
  auVar72._8_4_ = fVar201 * auVar58._8_4_;
  auVar72._12_4_ = fVar210 * auVar58._12_4_;
  auVar52 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar5,auVar52);
  auVar49 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar73);
  auVar66 = vsubps_avx512vl(auVar61,auVar54);
  uVar127 = auVar66._0_4_;
  auVar84._4_4_ = uVar127;
  auVar84._0_4_ = uVar127;
  auVar84._8_4_ = uVar127;
  auVar84._12_4_ = uVar127;
  auVar52 = vshufps_avx(auVar66,auVar66,0x55);
  auVar58 = vshufps_avx(auVar66,auVar66,0xaa);
  auVar74._0_4_ = fVar162 * auVar58._0_4_;
  auVar74._4_4_ = fVar215 * auVar58._4_4_;
  auVar74._8_4_ = fVar201 * auVar58._8_4_;
  auVar74._12_4_ = fVar210 * auVar58._12_4_;
  auVar52 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar5,auVar52);
  auVar50 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar84);
  auVar42 = vsubps_avx(auVar45,auVar54);
  uVar127 = auVar42._0_4_;
  auVar89._4_4_ = uVar127;
  auVar89._0_4_ = uVar127;
  auVar89._8_4_ = uVar127;
  auVar89._12_4_ = uVar127;
  auVar52 = vshufps_avx(auVar42,auVar42,0x55);
  auVar58 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar87._0_4_ = fVar162 * auVar58._0_4_;
  auVar87._4_4_ = fVar215 * auVar58._4_4_;
  auVar87._8_4_ = fVar201 * auVar58._8_4_;
  auVar87._12_4_ = fVar210 * auVar58._12_4_;
  auVar52 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar5,auVar52);
  auVar71 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar89);
  auVar67 = vsubps_avx512vl(auVar63,auVar54);
  uVar127 = auVar67._0_4_;
  auVar90._4_4_ = uVar127;
  auVar90._0_4_ = uVar127;
  auVar90._8_4_ = uVar127;
  auVar90._12_4_ = uVar127;
  auVar52 = vshufps_avx(auVar67,auVar67,0x55);
  auVar58 = vshufps_avx(auVar67,auVar67,0xaa);
  auVar195._0_4_ = auVar58._0_4_ * fVar162;
  auVar195._4_4_ = auVar58._4_4_ * fVar215;
  auVar195._8_4_ = auVar58._8_4_ * fVar201;
  auVar195._12_4_ = auVar58._12_4_ * fVar210;
  auVar52 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar5,auVar52);
  auVar55 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar90);
  auVar68 = vsubps_avx512vl(auVar40,auVar54);
  uVar127 = auVar68._0_4_;
  auVar178._4_4_ = uVar127;
  auVar178._0_4_ = uVar127;
  auVar178._8_4_ = uVar127;
  auVar178._12_4_ = uVar127;
  auVar52 = vshufps_avx(auVar68,auVar68,0x55);
  auVar58 = vshufps_avx(auVar68,auVar68,0xaa);
  auVar202._0_4_ = auVar58._0_4_ * fVar162;
  auVar202._4_4_ = auVar58._4_4_ * fVar215;
  auVar202._8_4_ = auVar58._8_4_ * fVar201;
  auVar202._12_4_ = auVar58._12_4_ * fVar210;
  auVar52 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar5,auVar52);
  auVar36 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar178);
  auVar69 = vsubps_avx512vl(auVar41,auVar54);
  uVar127 = auVar69._0_4_;
  auVar179._4_4_ = uVar127;
  auVar179._0_4_ = uVar127;
  auVar179._8_4_ = uVar127;
  auVar179._12_4_ = uVar127;
  auVar52 = vshufps_avx(auVar69,auVar69,0x55);
  auVar58 = vshufps_avx(auVar69,auVar69,0xaa);
  auVar217._0_4_ = auVar58._0_4_ * fVar162;
  auVar217._4_4_ = auVar58._4_4_ * fVar215;
  auVar217._8_4_ = auVar58._8_4_ * fVar201;
  auVar217._12_4_ = auVar58._12_4_ * fVar210;
  auVar52 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar5,auVar52);
  auVar37 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar179);
  auVar43 = vsubps_avx(auVar46,auVar54);
  uVar127 = auVar43._0_4_;
  auVar145._4_4_ = uVar127;
  auVar145._0_4_ = uVar127;
  auVar145._8_4_ = uVar127;
  auVar145._12_4_ = uVar127;
  auVar54 = vshufps_avx(auVar43,auVar43,0x55);
  auVar52 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar86._0_4_ = auVar52._0_4_ * fVar162;
  auVar86._4_4_ = auVar52._4_4_ * fVar215;
  auVar86._8_4_ = auVar52._8_4_ * fVar201;
  auVar86._12_4_ = auVar52._12_4_ * fVar210;
  auVar54 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar5,auVar54);
  auVar39 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar4,auVar145);
  auVar58 = vmovlhps_avx(auVar48,auVar55);
  auVar57 = vmovlhps_avx(auVar49,auVar36);
  auVar59 = vmovlhps_avx(auVar50,auVar37);
  auVar44 = vmovlhps_avx512f(auVar71,auVar39);
  auVar52 = vminps_avx(auVar58,auVar57);
  auVar54 = vmaxps_avx(auVar58,auVar57);
  auVar47 = vminps_avx512vl(auVar59,auVar44);
  auVar52 = vminps_avx(auVar52,auVar47);
  auVar47 = vmaxps_avx512vl(auVar59,auVar44);
  auVar54 = vmaxps_avx(auVar54,auVar47);
  auVar47 = vshufpd_avx(auVar52,auVar52,3);
  auVar52 = vminps_avx(auVar52,auVar47);
  auVar47 = vshufpd_avx(auVar54,auVar54,3);
  auVar54 = vmaxps_avx(auVar54,auVar47);
  auVar52 = vandps_avx512vl(auVar52,auVar250._0_16_);
  auVar54 = vandps_avx512vl(auVar54,auVar250._0_16_);
  auVar54 = vmaxps_avx(auVar52,auVar54);
  auVar52 = vmovshdup_avx(auVar54);
  auVar54 = vmaxss_avx(auVar52,auVar54);
  fVar162 = auVar54._0_4_ * 9.536743e-07;
  auVar70 = vmovddup_avx512vl(auVar48);
  auVar49 = vmovddup_avx512vl(auVar49);
  auVar50 = vmovddup_avx512vl(auVar50);
  auVar71 = vmovddup_avx512vl(auVar71);
  auVar93 = vbroadcastss_avx512vl(ZEXT416((uint)fVar162));
  auVar54 = vxorps_avx512vl(auVar93._0_16_,auVar62);
  auVar94 = vbroadcastss_avx512vl(auVar54);
  uVar25 = 0;
  auVar54 = vsubps_avx(auVar57,auVar58);
  auVar52 = vsubps_avx(auVar59,auVar57);
  auVar62 = vsubps_avx512vl(auVar44,auVar59);
  auVar72 = vsubps_avx512vl(auVar63,auVar56);
  auVar73 = vsubps_avx512vl(auVar40,auVar60);
  auVar74 = vsubps_avx512vl(auVar41,auVar61);
  auVar47 = vsubps_avx(auVar46,auVar45);
  auVar75 = vpbroadcastd_avx512vl();
  auVar76 = vpbroadcastd_avx512vl();
  auVar48 = ZEXT816(0x3f80000000000000);
  auVar38 = auVar48;
LAB_018bcb9f:
  do {
    auVar145 = vshufps_avx(auVar38,auVar38,0x50);
    auVar234._8_4_ = 0x3f800000;
    auVar234._0_8_ = 0x3f8000003f800000;
    auVar234._12_4_ = 0x3f800000;
    auVar115._16_4_ = 0x3f800000;
    auVar115._0_16_ = auVar234;
    auVar115._20_4_ = 0x3f800000;
    auVar115._24_4_ = 0x3f800000;
    auVar115._28_4_ = 0x3f800000;
    auVar80 = vsubps_avx(auVar234,auVar145);
    fVar215 = auVar145._0_4_;
    fVar143 = auVar55._0_4_;
    auVar146._0_4_ = fVar143 * fVar215;
    fVar201 = auVar145._4_4_;
    fVar150 = auVar55._4_4_;
    auVar146._4_4_ = fVar150 * fVar201;
    fVar210 = auVar145._8_4_;
    auVar146._8_4_ = fVar143 * fVar210;
    fVar211 = auVar145._12_4_;
    auVar146._12_4_ = fVar150 * fVar211;
    fVar154 = auVar36._0_4_;
    auVar155._0_4_ = fVar154 * fVar215;
    fVar161 = auVar36._4_4_;
    auVar155._4_4_ = fVar161 * fVar201;
    auVar155._8_4_ = fVar154 * fVar210;
    auVar155._12_4_ = fVar161 * fVar211;
    fVar164 = auVar37._0_4_;
    auVar165._0_4_ = fVar164 * fVar215;
    fVar170 = auVar37._4_4_;
    auVar165._4_4_ = fVar170 * fVar201;
    auVar165._8_4_ = fVar164 * fVar210;
    auVar165._12_4_ = fVar170 * fVar211;
    fVar171 = auVar39._0_4_;
    auVar133._0_4_ = fVar171 * fVar215;
    fVar176 = auVar39._4_4_;
    auVar133._4_4_ = fVar176 * fVar201;
    auVar133._8_4_ = fVar171 * fVar210;
    auVar133._12_4_ = fVar176 * fVar211;
    auVar77 = vfmadd231ps_avx512vl(auVar146,auVar80,auVar70);
    auVar78 = vfmadd231ps_avx512vl(auVar155,auVar80,auVar49);
    auVar79 = vfmadd231ps_avx512vl(auVar165,auVar80,auVar50);
    auVar80 = vfmadd231ps_avx512vl(auVar133,auVar71,auVar80);
    auVar145 = vmovshdup_avx(auVar48);
    fVar201 = auVar48._0_4_;
    fVar215 = (auVar145._0_4_ - fVar201) * 0.04761905;
    auVar109._4_4_ = fVar201;
    auVar109._0_4_ = fVar201;
    auVar109._8_4_ = fVar201;
    auVar109._12_4_ = fVar201;
    auVar109._16_4_ = fVar201;
    auVar109._20_4_ = fVar201;
    auVar109._24_4_ = fVar201;
    auVar109._28_4_ = fVar201;
    auVar98._0_8_ = auVar145._0_8_;
    auVar98._8_8_ = auVar98._0_8_;
    auVar98._16_8_ = auVar98._0_8_;
    auVar98._24_8_ = auVar98._0_8_;
    auVar112 = vsubps_avx(auVar98,auVar109);
    uVar127 = auVar77._0_4_;
    auVar113._4_4_ = uVar127;
    auVar113._0_4_ = uVar127;
    auVar113._8_4_ = uVar127;
    auVar113._12_4_ = uVar127;
    auVar113._16_4_ = uVar127;
    auVar113._20_4_ = uVar127;
    auVar113._24_4_ = uVar127;
    auVar113._28_4_ = uVar127;
    auVar101._8_4_ = 1;
    auVar101._0_8_ = 0x100000001;
    auVar101._12_4_ = 1;
    auVar101._16_4_ = 1;
    auVar101._20_4_ = 1;
    auVar101._24_4_ = 1;
    auVar101._28_4_ = 1;
    auVar111 = ZEXT1632(auVar77);
    auVar110 = vpermps_avx2(auVar101,auVar111);
    auVar95 = vbroadcastss_avx512vl(auVar78);
    auVar105 = ZEXT1632(auVar78);
    auVar96 = vpermps_avx512vl(auVar101,auVar105);
    auVar97 = vbroadcastss_avx512vl(auVar79);
    auVar106 = ZEXT1632(auVar79);
    auVar98 = vpermps_avx512vl(auVar101,auVar106);
    auVar99 = vbroadcastss_avx512vl(auVar80);
    auVar108 = ZEXT1632(auVar80);
    auVar100 = vpermps_avx512vl(auVar101,auVar108);
    auVar114._4_4_ = fVar215;
    auVar114._0_4_ = fVar215;
    auVar114._8_4_ = fVar215;
    auVar114._12_4_ = fVar215;
    auVar114._16_4_ = fVar215;
    auVar114._20_4_ = fVar215;
    auVar114._24_4_ = fVar215;
    auVar114._28_4_ = fVar215;
    auVar107._8_4_ = 2;
    auVar107._0_8_ = 0x200000002;
    auVar107._12_4_ = 2;
    auVar107._16_4_ = 2;
    auVar107._20_4_ = 2;
    auVar107._24_4_ = 2;
    auVar107._28_4_ = 2;
    auVar101 = vpermps_avx512vl(auVar107,auVar111);
    auVar102 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar103 = vpermps_avx512vl(auVar102,auVar111);
    auVar104 = vpermps_avx512vl(auVar107,auVar105);
    auVar105 = vpermps_avx512vl(auVar102,auVar105);
    auVar111 = vpermps_avx2(auVar107,auVar106);
    auVar106 = vpermps_avx512vl(auVar102,auVar106);
    auVar107 = vpermps_avx512vl(auVar107,auVar108);
    auVar102 = vpermps_avx512vl(auVar102,auVar108);
    auVar145 = vfmadd132ps_fma(auVar112,auVar109,_DAT_01f7b040);
    auVar112 = vsubps_avx(auVar115,ZEXT1632(auVar145));
    auVar108 = vmulps_avx512vl(auVar95,ZEXT1632(auVar145));
    auVar115 = ZEXT1632(auVar145);
    auVar109 = vmulps_avx512vl(auVar96,auVar115);
    auVar80 = vfmadd231ps_fma(auVar108,auVar112,auVar113);
    auVar77 = vfmadd231ps_fma(auVar109,auVar112,auVar110);
    auVar108 = vmulps_avx512vl(auVar97,auVar115);
    auVar109 = vmulps_avx512vl(auVar98,auVar115);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar112,auVar95);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar112,auVar96);
    auVar95 = vmulps_avx512vl(auVar99,auVar115);
    auVar113 = ZEXT1632(auVar145);
    auVar96 = vmulps_avx512vl(auVar100,auVar113);
    auVar97 = vfmadd231ps_avx512vl(auVar95,auVar112,auVar97);
    auVar98 = vfmadd231ps_avx512vl(auVar96,auVar112,auVar98);
    fVar210 = auVar145._0_4_;
    fVar211 = auVar145._4_4_;
    auVar95._4_4_ = fVar211 * auVar108._4_4_;
    auVar95._0_4_ = fVar210 * auVar108._0_4_;
    fVar212 = auVar145._8_4_;
    auVar95._8_4_ = fVar212 * auVar108._8_4_;
    fVar213 = auVar145._12_4_;
    auVar95._12_4_ = fVar213 * auVar108._12_4_;
    auVar95._16_4_ = auVar108._16_4_ * 0.0;
    auVar95._20_4_ = auVar108._20_4_ * 0.0;
    auVar95._24_4_ = auVar108._24_4_ * 0.0;
    auVar95._28_4_ = fVar201;
    auVar96._4_4_ = fVar211 * auVar109._4_4_;
    auVar96._0_4_ = fVar210 * auVar109._0_4_;
    auVar96._8_4_ = fVar212 * auVar109._8_4_;
    auVar96._12_4_ = fVar213 * auVar109._12_4_;
    auVar96._16_4_ = auVar109._16_4_ * 0.0;
    auVar96._20_4_ = auVar109._20_4_ * 0.0;
    auVar96._24_4_ = auVar109._24_4_ * 0.0;
    auVar96._28_4_ = auVar110._28_4_;
    auVar80 = vfmadd231ps_fma(auVar95,auVar112,ZEXT1632(auVar80));
    auVar77 = vfmadd231ps_fma(auVar96,auVar112,ZEXT1632(auVar77));
    auVar100._0_4_ = fVar210 * auVar97._0_4_;
    auVar100._4_4_ = fVar211 * auVar97._4_4_;
    auVar100._8_4_ = fVar212 * auVar97._8_4_;
    auVar100._12_4_ = fVar213 * auVar97._12_4_;
    auVar100._16_4_ = auVar97._16_4_ * 0.0;
    auVar100._20_4_ = auVar97._20_4_ * 0.0;
    auVar100._24_4_ = auVar97._24_4_ * 0.0;
    auVar100._28_4_ = 0;
    auVar110._4_4_ = fVar211 * auVar98._4_4_;
    auVar110._0_4_ = fVar210 * auVar98._0_4_;
    auVar110._8_4_ = fVar212 * auVar98._8_4_;
    auVar110._12_4_ = fVar213 * auVar98._12_4_;
    auVar110._16_4_ = auVar98._16_4_ * 0.0;
    auVar110._20_4_ = auVar98._20_4_ * 0.0;
    auVar110._24_4_ = auVar98._24_4_ * 0.0;
    auVar110._28_4_ = auVar97._28_4_;
    auVar78 = vfmadd231ps_fma(auVar100,auVar112,auVar108);
    auVar79 = vfmadd231ps_fma(auVar110,auVar112,auVar109);
    auVar97._28_4_ = auVar109._28_4_;
    auVar97._0_28_ =
         ZEXT1628(CONCAT412(fVar213 * auVar79._12_4_,
                            CONCAT48(fVar212 * auVar79._8_4_,
                                     CONCAT44(fVar211 * auVar79._4_4_,fVar210 * auVar79._0_4_))));
    auVar85 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar213 * auVar78._12_4_,
                                                 CONCAT48(fVar212 * auVar78._8_4_,
                                                          CONCAT44(fVar211 * auVar78._4_4_,
                                                                   fVar210 * auVar78._0_4_)))),
                              auVar112,ZEXT1632(auVar80));
    auVar91 = vfmadd231ps_fma(auVar97,auVar112,ZEXT1632(auVar77));
    auVar110 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar80));
    auVar95 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar77));
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar110 = vmulps_avx512vl(auVar110,auVar96);
    auVar95 = vmulps_avx512vl(auVar95,auVar96);
    auVar108._0_4_ = fVar215 * auVar110._0_4_;
    auVar108._4_4_ = fVar215 * auVar110._4_4_;
    auVar108._8_4_ = fVar215 * auVar110._8_4_;
    auVar108._12_4_ = fVar215 * auVar110._12_4_;
    auVar108._16_4_ = fVar215 * auVar110._16_4_;
    auVar108._20_4_ = fVar215 * auVar110._20_4_;
    auVar108._24_4_ = fVar215 * auVar110._24_4_;
    auVar108._28_4_ = 0;
    auVar110 = vmulps_avx512vl(auVar114,auVar95);
    auVar77 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
    auVar95 = vpermt2ps_avx512vl(ZEXT1632(auVar85),_DAT_01fb9fc0,ZEXT1632(auVar77));
    auVar97 = vpermt2ps_avx512vl(ZEXT1632(auVar91),_DAT_01fb9fc0,ZEXT1632(auVar77));
    auVar136._0_4_ = auVar108._0_4_ + auVar85._0_4_;
    auVar136._4_4_ = auVar108._4_4_ + auVar85._4_4_;
    auVar136._8_4_ = auVar108._8_4_ + auVar85._8_4_;
    auVar136._12_4_ = auVar108._12_4_ + auVar85._12_4_;
    auVar136._16_4_ = auVar108._16_4_ + 0.0;
    auVar136._20_4_ = auVar108._20_4_ + 0.0;
    auVar136._24_4_ = auVar108._24_4_ + 0.0;
    auVar136._28_4_ = 0;
    auVar109 = ZEXT1632(auVar77);
    auVar98 = vpermt2ps_avx512vl(auVar108,_DAT_01fb9fc0,auVar109);
    auVar99 = vaddps_avx512vl(ZEXT1632(auVar91),auVar110);
    auVar100 = vpermt2ps_avx512vl(auVar110,_DAT_01fb9fc0,auVar109);
    auVar110 = vsubps_avx(auVar95,auVar98);
    auVar98 = vsubps_avx512vl(auVar97,auVar100);
    auVar100 = vmulps_avx512vl(auVar104,auVar113);
    auVar108 = vmulps_avx512vl(auVar105,auVar113);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar112,auVar101);
    auVar101 = vfmadd231ps_avx512vl(auVar108,auVar112,auVar103);
    auVar103 = vmulps_avx512vl(auVar111,auVar113);
    auVar108 = vmulps_avx512vl(auVar106,auVar113);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar112,auVar104);
    auVar104 = vfmadd231ps_avx512vl(auVar108,auVar112,auVar105);
    auVar105 = vmulps_avx512vl(auVar107,auVar113);
    auVar102 = vmulps_avx512vl(auVar102,auVar113);
    auVar80 = vfmadd231ps_fma(auVar105,auVar112,auVar111);
    auVar111 = vfmadd231ps_avx512vl(auVar102,auVar112,auVar106);
    auVar102 = vmulps_avx512vl(auVar113,auVar103);
    auVar107 = ZEXT1632(auVar145);
    auVar105 = vmulps_avx512vl(auVar107,auVar104);
    auVar100 = vfmadd231ps_avx512vl(auVar102,auVar112,auVar100);
    auVar101 = vfmadd231ps_avx512vl(auVar105,auVar112,auVar101);
    auVar111 = vmulps_avx512vl(auVar107,auVar111);
    auVar102 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar213 * auVar80._12_4_,
                                             CONCAT48(fVar212 * auVar80._8_4_,
                                                      CONCAT44(fVar211 * auVar80._4_4_,
                                                               fVar210 * auVar80._0_4_)))),auVar112,
                          auVar103);
    auVar103 = vfmadd231ps_avx512vl(auVar111,auVar112,auVar104);
    auVar111._4_4_ = fVar211 * auVar102._4_4_;
    auVar111._0_4_ = fVar210 * auVar102._0_4_;
    auVar111._8_4_ = fVar212 * auVar102._8_4_;
    auVar111._12_4_ = fVar213 * auVar102._12_4_;
    auVar111._16_4_ = auVar102._16_4_ * 0.0;
    auVar111._20_4_ = auVar102._20_4_ * 0.0;
    auVar111._24_4_ = auVar102._24_4_ * 0.0;
    auVar111._28_4_ = auVar106._28_4_;
    auVar104 = vmulps_avx512vl(auVar107,auVar103);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar112,auVar100);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,auVar112);
    auVar112 = vsubps_avx512vl(auVar102,auVar100);
    auVar100 = vsubps_avx512vl(auVar103,auVar101);
    auVar101 = vmulps_avx512vl(auVar112,auVar96);
    auVar96 = vmulps_avx512vl(auVar100,auVar96);
    fVar201 = fVar215 * auVar101._0_4_;
    fVar210 = fVar215 * auVar101._4_4_;
    auVar112._4_4_ = fVar210;
    auVar112._0_4_ = fVar201;
    fVar211 = fVar215 * auVar101._8_4_;
    auVar112._8_4_ = fVar211;
    fVar212 = fVar215 * auVar101._12_4_;
    auVar112._12_4_ = fVar212;
    fVar213 = fVar215 * auVar101._16_4_;
    auVar112._16_4_ = fVar213;
    fVar214 = fVar215 * auVar101._20_4_;
    auVar112._20_4_ = fVar214;
    fVar215 = fVar215 * auVar101._24_4_;
    auVar112._24_4_ = fVar215;
    auVar112._28_4_ = auVar101._28_4_;
    auVar96 = vmulps_avx512vl(auVar114,auVar96);
    auVar100 = vpermt2ps_avx512vl(auVar111,_DAT_01fb9fc0,auVar109);
    auVar102 = vpermt2ps_avx512vl(auVar104,_DAT_01fb9fc0,auVar109);
    auVar200._0_4_ = auVar111._0_4_ + fVar201;
    auVar200._4_4_ = auVar111._4_4_ + fVar210;
    auVar200._8_4_ = auVar111._8_4_ + fVar211;
    auVar200._12_4_ = auVar111._12_4_ + fVar212;
    auVar200._16_4_ = auVar111._16_4_ + fVar213;
    auVar200._20_4_ = auVar111._20_4_ + fVar214;
    auVar200._24_4_ = auVar111._24_4_ + fVar215;
    auVar200._28_4_ = auVar111._28_4_ + auVar101._28_4_;
    auVar112 = vpermt2ps_avx512vl(auVar112,_DAT_01fb9fc0,ZEXT1632(auVar77));
    auVar101 = vaddps_avx512vl(auVar104,auVar96);
    auVar96 = vpermt2ps_avx512vl(auVar96,_DAT_01fb9fc0,ZEXT1632(auVar77));
    auVar112 = vsubps_avx(auVar100,auVar112);
    auVar96 = vsubps_avx512vl(auVar102,auVar96);
    auVar117 = ZEXT1632(auVar85);
    auVar103 = vsubps_avx512vl(auVar111,auVar117);
    auVar116 = ZEXT1632(auVar91);
    auVar105 = vsubps_avx512vl(auVar104,auVar116);
    auVar106 = vsubps_avx512vl(auVar100,auVar95);
    auVar103 = vaddps_avx512vl(auVar103,auVar106);
    auVar106 = vsubps_avx512vl(auVar102,auVar97);
    auVar105 = vaddps_avx512vl(auVar105,auVar106);
    auVar106 = vmulps_avx512vl(auVar116,auVar103);
    auVar106 = vfnmadd231ps_avx512vl(auVar106,auVar117,auVar105);
    auVar107 = vmulps_avx512vl(auVar99,auVar103);
    auVar107 = vfnmadd231ps_avx512vl(auVar107,auVar136,auVar105);
    auVar108 = vmulps_avx512vl(auVar98,auVar103);
    auVar108 = vfnmadd231ps_avx512vl(auVar108,auVar110,auVar105);
    auVar109 = vmulps_avx512vl(auVar97,auVar103);
    auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar95,auVar105);
    auVar113 = vmulps_avx512vl(auVar104,auVar103);
    auVar113 = vfnmadd231ps_avx512vl(auVar113,auVar111,auVar105);
    auVar114 = vmulps_avx512vl(auVar101,auVar103);
    auVar114 = vfnmadd231ps_avx512vl(auVar114,auVar200,auVar105);
    auVar115 = vmulps_avx512vl(auVar96,auVar103);
    auVar115 = vfnmadd231ps_avx512vl(auVar115,auVar112,auVar105);
    auVar103 = vmulps_avx512vl(auVar102,auVar103);
    auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar100,auVar105);
    auVar105 = vminps_avx512vl(auVar106,auVar107);
    auVar106 = vmaxps_avx512vl(auVar106,auVar107);
    auVar107 = vminps_avx512vl(auVar108,auVar109);
    auVar105 = vminps_avx512vl(auVar105,auVar107);
    auVar107 = vmaxps_avx512vl(auVar108,auVar109);
    auVar106 = vmaxps_avx512vl(auVar106,auVar107);
    auVar107 = vminps_avx512vl(auVar113,auVar114);
    auVar108 = vmaxps_avx512vl(auVar113,auVar114);
    auVar109 = vminps_avx512vl(auVar115,auVar103);
    auVar107 = vminps_avx512vl(auVar107,auVar109);
    auVar105 = vminps_avx512vl(auVar105,auVar107);
    auVar103 = vmaxps_avx512vl(auVar115,auVar103);
    auVar103 = vmaxps_avx512vl(auVar108,auVar103);
    auVar103 = vmaxps_avx512vl(auVar106,auVar103);
    auVar145 = auVar103._0_16_;
    uVar14 = vcmpps_avx512vl(auVar105,auVar93,2);
    uVar15 = vcmpps_avx512vl(auVar103,auVar94,5);
    bVar22 = (byte)uVar14 & (byte)uVar15 & 0x7f;
    if (bVar22 != 0) {
      auVar103 = vsubps_avx512vl(auVar95,auVar117);
      auVar105 = vsubps_avx512vl(auVar97,auVar116);
      auVar106 = vsubps_avx512vl(auVar100,auVar111);
      auVar103 = vaddps_avx512vl(auVar103,auVar106);
      auVar145 = auVar103._0_16_;
      auVar106 = vsubps_avx512vl(auVar102,auVar104);
      auVar105 = vaddps_avx512vl(auVar105,auVar106);
      auVar106 = vmulps_avx512vl(auVar116,auVar103);
      auVar106 = vfnmadd231ps_avx512vl(auVar106,auVar105,auVar117);
      auVar99 = vmulps_avx512vl(auVar99,auVar103);
      auVar99 = vfnmadd213ps_avx512vl(auVar136,auVar105,auVar99);
      auVar98 = vmulps_avx512vl(auVar98,auVar103);
      auVar98 = vfnmadd213ps_avx512vl(auVar110,auVar105,auVar98);
      auVar110 = vmulps_avx512vl(auVar97,auVar103);
      auVar97 = vfnmadd231ps_avx512vl(auVar110,auVar105,auVar95);
      auVar110 = vmulps_avx512vl(auVar104,auVar103);
      auVar104 = vfnmadd231ps_avx512vl(auVar110,auVar105,auVar111);
      auVar110 = vmulps_avx512vl(auVar101,auVar103);
      auVar101 = vfnmadd213ps_avx512vl(auVar200,auVar105,auVar110);
      auVar110 = vmulps_avx512vl(auVar96,auVar103);
      auVar107 = vfnmadd213ps_avx512vl(auVar112,auVar105,auVar110);
      auVar112 = vmulps_avx512vl(auVar102,auVar103);
      auVar100 = vfnmadd231ps_avx512vl(auVar112,auVar100,auVar105);
      auVar110 = vminps_avx(auVar106,auVar99);
      auVar112 = vmaxps_avx(auVar106,auVar99);
      auVar95 = vminps_avx(auVar98,auVar97);
      auVar95 = vminps_avx(auVar110,auVar95);
      auVar110 = vmaxps_avx(auVar98,auVar97);
      auVar112 = vmaxps_avx(auVar112,auVar110);
      auVar111 = vminps_avx(auVar104,auVar101);
      auVar110 = vmaxps_avx(auVar104,auVar101);
      auVar96 = vminps_avx(auVar107,auVar100);
      auVar111 = vminps_avx(auVar111,auVar96);
      auVar111 = vminps_avx(auVar95,auVar111);
      auVar95 = vmaxps_avx(auVar107,auVar100);
      auVar110 = vmaxps_avx(auVar110,auVar95);
      auVar112 = vmaxps_avx(auVar112,auVar110);
      uVar14 = vcmpps_avx512vl(auVar112,auVar94,5);
      uVar15 = vcmpps_avx512vl(auVar111,auVar93,2);
      bVar22 = bVar22 & (byte)uVar14 & (byte)uVar15;
      if (bVar22 != 0) {
        mask_stack[uVar25] = (uint)bVar22;
        BVar3 = (BBox1f)vmovlps_avx(auVar48);
        cu_stack[uVar25] = BVar3;
        BVar3 = (BBox1f)vmovlps_avx(auVar38);
        cv_stack[uVar25] = BVar3;
        uVar25 = (ulong)((int)uVar25 + 1);
      }
    }
    auVar48 = vxorps_avx512vl(auVar145,auVar145);
    auVar245 = ZEXT1664(auVar48);
    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar249 = ZEXT1664(auVar48);
    auVar112 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar246 = ZEXT3264(auVar112);
    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar247 = ZEXT1664(auVar48);
    auVar248 = ZEXT3264(_DAT_01fb9fe0);
    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar252 = ZEXT1664(auVar48);
LAB_018bd09f:
    do {
      do {
        do {
          auVar145 = auVar245._0_16_;
          auVar80 = auVar249._0_16_;
          if ((int)uVar25 == 0) {
            uVar127 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar19._4_4_ = uVar127;
            auVar19._0_4_ = uVar127;
            auVar19._8_4_ = uVar127;
            auVar19._12_4_ = uVar127;
            uVar14 = vcmpps_avx512vl(auVar53,auVar19,2);
            uVar30 = (ulong)((uint)uVar30 & (uint)uVar30 + 0xf & (uint)uVar14);
            goto LAB_018bc099;
          }
          uVar23 = (int)uVar25 - 1;
          uVar7 = mask_stack[uVar23];
          auVar38._8_8_ = 0;
          auVar38._0_4_ = cv_stack[uVar23].lower;
          auVar38._4_4_ = cv_stack[uVar23].upper;
          uVar35 = 0;
          for (uVar28 = (ulong)uVar7; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000)
          {
            uVar35 = uVar35 + 1;
          }
          uVar26 = uVar7 - 1 & uVar7;
          bVar33 = uVar26 == 0;
          mask_stack[uVar23] = uVar26;
          if (bVar33) {
            uVar25 = (ulong)uVar23;
          }
          auVar128._8_8_ = 0;
          auVar128._0_8_ = uVar35;
          auVar48 = vpunpcklqdq_avx(auVar128,ZEXT416((int)uVar35 + 1));
          auVar48 = vcvtqq2ps_avx512vl(auVar48);
          auVar48 = vmulps_avx512vl(auVar48,auVar247._0_16_);
          fVar215 = cu_stack[uVar23].upper;
          auVar16._4_4_ = fVar215;
          auVar16._0_4_ = fVar215;
          auVar16._8_4_ = fVar215;
          auVar16._12_4_ = fVar215;
          auVar77 = vmulps_avx512vl(auVar48,auVar16);
          auVar137._8_4_ = 0x3f800000;
          auVar137._0_8_ = 0x3f8000003f800000;
          auVar137._12_4_ = 0x3f800000;
          auVar48 = vsubps_avx(auVar137,auVar48);
          fVar215 = cu_stack[uVar23].lower;
          auVar17._4_4_ = fVar215;
          auVar17._0_4_ = fVar215;
          auVar17._8_4_ = fVar215;
          auVar17._12_4_ = fVar215;
          auVar48 = vfmadd231ps_avx512vl(auVar77,auVar48,auVar17);
          auVar77 = vmovshdup_avx(auVar48);
          fVar215 = auVar77._0_4_ - auVar48._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar215));
          if (uVar7 == 0 || bVar33) goto LAB_018bcb9f;
          auVar77 = vshufps_avx(auVar38,auVar38,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar215));
          auVar147._8_4_ = 0x3f800000;
          auVar147._0_8_ = 0x3f8000003f800000;
          auVar147._12_4_ = 0x3f800000;
          auVar78 = vsubps_avx(auVar147,auVar77);
          fVar201 = auVar77._0_4_;
          auVar156._0_4_ = fVar201 * fVar143;
          fVar210 = auVar77._4_4_;
          auVar156._4_4_ = fVar210 * fVar150;
          fVar211 = auVar77._8_4_;
          auVar156._8_4_ = fVar211 * fVar143;
          fVar212 = auVar77._12_4_;
          auVar156._12_4_ = fVar212 * fVar150;
          auVar166._0_4_ = fVar201 * fVar154;
          auVar166._4_4_ = fVar210 * fVar161;
          auVar166._8_4_ = fVar211 * fVar154;
          auVar166._12_4_ = fVar212 * fVar161;
          auVar172._0_4_ = fVar201 * fVar164;
          auVar172._4_4_ = fVar210 * fVar170;
          auVar172._8_4_ = fVar211 * fVar164;
          auVar172._12_4_ = fVar212 * fVar170;
          auVar138._0_4_ = fVar201 * fVar171;
          auVar138._4_4_ = fVar210 * fVar176;
          auVar138._8_4_ = fVar211 * fVar171;
          auVar138._12_4_ = fVar212 * fVar176;
          auVar77 = vfmadd231ps_fma(auVar156,auVar78,auVar70);
          auVar79 = vfmadd231ps_fma(auVar166,auVar78,auVar49);
          auVar85 = vfmadd231ps_fma(auVar172,auVar78,auVar50);
          auVar78 = vfmadd231ps_fma(auVar138,auVar78,auVar71);
          auVar102._16_16_ = auVar77;
          auVar102._0_16_ = auVar77;
          auVar103._16_16_ = auVar79;
          auVar103._0_16_ = auVar79;
          auVar105._16_16_ = auVar85;
          auVar105._0_16_ = auVar85;
          auVar110 = vpermps_avx512vl(auVar248._0_32_,ZEXT1632(auVar48));
          auVar112 = vsubps_avx(auVar103,auVar102);
          auVar79 = vfmadd213ps_fma(auVar112,auVar110,auVar102);
          auVar112 = vsubps_avx(auVar105,auVar103);
          auVar91 = vfmadd213ps_fma(auVar112,auVar110,auVar103);
          auVar77 = vsubps_avx(auVar78,auVar85);
          auVar104._16_16_ = auVar77;
          auVar104._0_16_ = auVar77;
          auVar77 = vfmadd213ps_fma(auVar104,auVar110,auVar105);
          auVar112 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar79));
          auVar78 = vfmadd213ps_fma(auVar112,auVar110,ZEXT1632(auVar79));
          auVar112 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar91));
          auVar77 = vfmadd213ps_fma(auVar112,auVar110,ZEXT1632(auVar91));
          auVar112 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar78));
          auVar177 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar112,auVar110);
          auVar112 = vmulps_avx512vl(auVar112,auVar246._0_32_);
          auVar99._16_16_ = auVar112._16_16_;
          auVar77 = vmulss_avx512f(ZEXT416((uint)fVar215),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar201 = auVar77._0_4_;
          auVar173._0_8_ =
               CONCAT44(auVar177._4_4_ + fVar201 * auVar112._4_4_,
                        auVar177._0_4_ + fVar201 * auVar112._0_4_);
          auVar173._8_4_ = auVar177._8_4_ + fVar201 * auVar112._8_4_;
          auVar173._12_4_ = auVar177._12_4_ + fVar201 * auVar112._12_4_;
          auVar157._0_4_ = fVar201 * auVar112._16_4_;
          auVar157._4_4_ = fVar201 * auVar112._20_4_;
          auVar157._8_4_ = fVar201 * auVar112._24_4_;
          auVar157._12_4_ = fVar201 * auVar112._28_4_;
          auVar87 = vsubps_avx((undefined1  [16])0x0,auVar157);
          auVar91 = vshufpd_avx(auVar177,auVar177,3);
          auVar88 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar77 = vsubps_avx(auVar91,auVar177);
          auVar78 = vsubps_avx(auVar88,(undefined1  [16])0x0);
          auVar185._0_4_ = auVar77._0_4_ + auVar78._0_4_;
          auVar185._4_4_ = auVar77._4_4_ + auVar78._4_4_;
          auVar185._8_4_ = auVar77._8_4_ + auVar78._8_4_;
          auVar185._12_4_ = auVar77._12_4_ + auVar78._12_4_;
          auVar77 = vshufps_avx(auVar177,auVar177,0xb1);
          auVar78 = vshufps_avx(auVar173,auVar173,0xb1);
          auVar79 = vshufps_avx(auVar87,auVar87,0xb1);
          auVar85 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar235._4_4_ = auVar185._0_4_;
          auVar235._0_4_ = auVar185._0_4_;
          auVar235._8_4_ = auVar185._0_4_;
          auVar235._12_4_ = auVar185._0_4_;
          auVar83 = vshufps_avx(auVar185,auVar185,0x55);
          fVar201 = auVar83._0_4_;
          auVar196._0_4_ = auVar77._0_4_ * fVar201;
          fVar210 = auVar83._4_4_;
          auVar196._4_4_ = auVar77._4_4_ * fVar210;
          fVar211 = auVar83._8_4_;
          auVar196._8_4_ = auVar77._8_4_ * fVar211;
          fVar212 = auVar83._12_4_;
          auVar196._12_4_ = auVar77._12_4_ * fVar212;
          auVar203._0_4_ = auVar78._0_4_ * fVar201;
          auVar203._4_4_ = auVar78._4_4_ * fVar210;
          auVar203._8_4_ = auVar78._8_4_ * fVar211;
          auVar203._12_4_ = auVar78._12_4_ * fVar212;
          auVar218._0_4_ = auVar79._0_4_ * fVar201;
          auVar218._4_4_ = auVar79._4_4_ * fVar210;
          auVar218._8_4_ = auVar79._8_4_ * fVar211;
          auVar218._12_4_ = auVar79._12_4_ * fVar212;
          auVar186._0_4_ = auVar85._0_4_ * fVar201;
          auVar186._4_4_ = auVar85._4_4_ * fVar210;
          auVar186._8_4_ = auVar85._8_4_ * fVar211;
          auVar186._12_4_ = auVar85._12_4_ * fVar212;
          auVar77 = vfmadd231ps_fma(auVar196,auVar235,auVar177);
          auVar78 = vfmadd231ps_fma(auVar203,auVar235,auVar173);
          auVar92 = vfmadd231ps_fma(auVar218,auVar235,auVar87);
          auVar86 = vfmadd231ps_fma(auVar186,(undefined1  [16])0x0,auVar235);
          auVar83 = vshufpd_avx(auVar77,auVar77,1);
          auVar84 = vshufpd_avx(auVar78,auVar78,1);
          auVar81 = vshufpd_avx512vl(auVar92,auVar92,1);
          auVar82 = vshufpd_avx512vl(auVar86,auVar86,1);
          auVar79 = vminss_avx(auVar77,auVar78);
          auVar77 = vmaxss_avx(auVar78,auVar77);
          auVar85 = vminss_avx(auVar92,auVar86);
          auVar78 = vmaxss_avx(auVar86,auVar92);
          auVar79 = vminss_avx(auVar79,auVar85);
          auVar77 = vmaxss_avx(auVar78,auVar77);
          auVar85 = vminss_avx(auVar83,auVar84);
          auVar78 = vmaxss_avx(auVar84,auVar83);
          auVar83 = vminss_avx512f(auVar81,auVar82);
          auVar84 = vmaxss_avx512f(auVar82,auVar81);
          auVar78 = vmaxss_avx(auVar84,auVar78);
          auVar85 = vminss_avx512f(auVar85,auVar83);
          vucomiss_avx512f(auVar79);
          fVar210 = auVar78._0_4_;
          fVar201 = auVar77._0_4_;
          if (4 < (uint)uVar25) {
            bVar34 = fVar210 == -0.0001;
            bVar31 = NAN(fVar210);
            if (fVar210 <= -0.0001) goto LAB_018bd2cf;
            break;
          }
LAB_018bd2cf:
          auVar83 = vucomiss_avx512f(auVar85);
          bVar34 = fVar210 <= -0.0001;
          bVar32 = -0.0001 < fVar201;
          bVar31 = bVar34;
          if (!bVar34) break;
          uVar14 = vcmpps_avx512vl(auVar79,auVar83,5);
          uVar15 = vcmpps_avx512vl(auVar85,auVar83,5);
          bVar22 = (byte)uVar14 & (byte)uVar15 & 1;
          bVar34 = bVar32 && bVar22 == 0;
          bVar31 = bVar32 && bVar22 == 0;
        } while (!bVar32 || bVar22 != 0);
        vcmpss_avx512f(auVar79,auVar145,1);
        auVar92 = auVar251._0_16_;
        uVar14 = vcmpss_avx512f(auVar77,auVar145,1);
        bVar32 = (bool)((byte)uVar14 & 1);
        auVar99._0_16_ = auVar92;
        iVar126 = auVar251._0_4_;
        auVar106._4_28_ = auVar99._4_28_;
        auVar106._0_4_ = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * iVar126);
        vucomiss_avx512f(auVar106._0_16_);
        bVar31 = (bool)(!bVar34 | bVar31);
        bVar32 = bVar31 == false;
        auVar117._16_16_ = auVar99._16_16_;
        auVar117._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar116._4_28_ = auVar117._4_28_;
        auVar116._0_4_ = (uint)bVar31 * auVar245._0_4_ + (uint)!bVar31 * 0x7f800000;
        auVar84 = auVar116._0_16_;
        auVar119._16_16_ = auVar99._16_16_;
        auVar119._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar118._4_28_ = auVar119._4_28_;
        auVar118._0_4_ = (uint)bVar31 * auVar245._0_4_ + (uint)!bVar31 * -0x800000;
        auVar83 = auVar118._0_16_;
        uVar14 = vcmpss_avx512f(auVar85,auVar145,1);
        bVar34 = (bool)((byte)uVar14 & 1);
        auVar121._16_16_ = auVar99._16_16_;
        auVar121._0_16_ = auVar92;
        auVar120._4_28_ = auVar121._4_28_;
        auVar120._0_4_ = (float)((uint)bVar34 * -0x40800000 + (uint)!bVar34 * iVar126);
        vucomiss_avx512f(auVar120._0_16_);
        if ((bVar31) || (bVar32)) {
          auVar85 = vucomiss_avx512f(auVar79);
          if ((bVar31) || (bVar32)) {
            auVar86 = vxorps_avx512vl(auVar79,auVar252._0_16_);
            auVar79 = vsubss_avx512f(auVar85,auVar79);
            auVar79 = vdivss_avx512f(auVar86,auVar79);
            auVar85 = vsubss_avx512f(auVar92,auVar79);
            auVar79 = vfmadd213ss_avx512f(auVar85,auVar145,auVar79);
            auVar85 = auVar79;
          }
          else {
            auVar85 = vxorps_avx512vl(auVar85,auVar85);
            vucomiss_avx512f(auVar85);
            if ((bVar31) || (auVar79 = auVar92, bVar32)) {
              auVar79 = SUB6416(ZEXT464(0xff800000),0);
              auVar85 = ZEXT416(0x7f800000);
            }
          }
          auVar84 = vminss_avx512f(auVar84,auVar85);
          auVar83 = vmaxss_avx(auVar79,auVar83);
        }
        uVar14 = vcmpss_avx512f(auVar78,auVar145,1);
        bVar34 = (bool)((byte)uVar14 & 1);
        fVar211 = (float)((uint)bVar34 * -0x40800000 + (uint)!bVar34 * iVar126);
        if ((auVar106._0_4_ != fVar211) || (NAN(auVar106._0_4_) || NAN(fVar211))) {
          if ((fVar210 != fVar201) || (NAN(fVar210) || NAN(fVar201))) {
            auVar77 = vxorps_avx512vl(auVar77,auVar252._0_16_);
            auVar187._0_4_ = auVar77._0_4_ / (fVar210 - fVar201);
            auVar187._4_12_ = auVar77._4_12_;
            auVar77 = vsubss_avx512f(auVar92,auVar187);
            auVar77 = vfmadd213ss_avx512f(auVar77,auVar145,auVar187);
            auVar78 = auVar77;
          }
          else if ((fVar201 != 0.0) ||
                  (auVar77 = auVar92, auVar78 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar201))) {
            auVar77 = SUB6416(ZEXT464(0xff800000),0);
            auVar78 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar84 = vminss_avx(auVar84,auVar78);
          auVar83 = vmaxss_avx(auVar77,auVar83);
        }
        bVar34 = auVar120._0_4_ != fVar211;
        auVar77 = vminss_avx512f(auVar84,auVar92);
        auVar123._16_16_ = auVar99._16_16_;
        auVar123._0_16_ = auVar84;
        auVar122._4_28_ = auVar123._4_28_;
        auVar122._0_4_ = (uint)bVar34 * auVar77._0_4_ + (uint)!bVar34 * auVar84._0_4_;
        auVar77 = vmaxss_avx512f(auVar92,auVar83);
        auVar125._16_16_ = auVar99._16_16_;
        auVar125._0_16_ = auVar83;
        auVar124._4_28_ = auVar125._4_28_;
        auVar124._0_4_ = (uint)bVar34 * auVar77._0_4_ + (uint)!bVar34 * auVar83._0_4_;
        auVar77 = vmaxss_avx512f(auVar145,auVar122._0_16_);
        auVar78 = vminss_avx512f(auVar124._0_16_,auVar92);
      } while (auVar78._0_4_ < auVar77._0_4_);
      auVar86 = vmaxss_avx512f(auVar145,ZEXT416((uint)(auVar77._0_4_ + -0.1)));
      auVar81 = vminss_avx512f(ZEXT416((uint)(auVar78._0_4_ + 0.1)),auVar92);
      auVar139._0_8_ = auVar177._0_8_;
      auVar139._8_8_ = auVar139._0_8_;
      auVar204._8_8_ = auVar173._0_8_;
      auVar204._0_8_ = auVar173._0_8_;
      auVar219._8_8_ = auVar87._0_8_;
      auVar219._0_8_ = auVar87._0_8_;
      auVar77 = vshufpd_avx(auVar173,auVar173,3);
      auVar78 = vshufpd_avx(auVar87,auVar87,3);
      auVar79 = vshufps_avx(auVar86,auVar81,0);
      auVar236._8_4_ = 0x3f800000;
      auVar236._0_8_ = 0x3f8000003f800000;
      auVar236._12_4_ = 0x3f800000;
      auVar85 = vsubps_avx(auVar236,auVar79);
      fVar201 = auVar79._0_4_;
      auVar167._0_4_ = fVar201 * auVar91._0_4_;
      fVar210 = auVar79._4_4_;
      auVar167._4_4_ = fVar210 * auVar91._4_4_;
      fVar211 = auVar79._8_4_;
      auVar167._8_4_ = fVar211 * auVar91._8_4_;
      fVar212 = auVar79._12_4_;
      auVar167._12_4_ = fVar212 * auVar91._12_4_;
      auVar174._0_4_ = fVar201 * auVar77._0_4_;
      auVar174._4_4_ = fVar210 * auVar77._4_4_;
      auVar174._8_4_ = fVar211 * auVar77._8_4_;
      auVar174._12_4_ = fVar212 * auVar77._12_4_;
      auVar240._0_4_ = auVar78._0_4_ * fVar201;
      auVar240._4_4_ = auVar78._4_4_ * fVar210;
      auVar240._8_4_ = auVar78._8_4_ * fVar211;
      auVar240._12_4_ = auVar78._12_4_ * fVar212;
      auVar158._0_4_ = fVar201 * auVar88._0_4_;
      auVar158._4_4_ = fVar210 * auVar88._4_4_;
      auVar158._8_4_ = fVar211 * auVar88._8_4_;
      auVar158._12_4_ = fVar212 * auVar88._12_4_;
      auVar91 = vfmadd231ps_fma(auVar167,auVar85,auVar139);
      auVar88 = vfmadd231ps_fma(auVar174,auVar85,auVar204);
      auVar83 = vfmadd231ps_fma(auVar240,auVar85,auVar219);
      auVar84 = vfmadd231ps_fma(auVar158,auVar85,ZEXT816(0));
      auVar78 = vsubss_avx512f(auVar92,auVar86);
      auVar77 = vmovshdup_avx(auVar38);
      auVar177 = vfmadd231ss_fma(ZEXT416((uint)(auVar77._0_4_ * auVar86._0_4_)),auVar38,auVar78);
      auVar78 = vsubss_avx512f(auVar92,auVar81);
      auVar81 = vfmadd231ss_fma(ZEXT416((uint)(auVar77._0_4_ * auVar81._0_4_)),auVar38,auVar78);
      auVar85 = vdivss_avx512f(auVar92,ZEXT416((uint)fVar215));
      auVar38 = vsubps_avx(auVar88,auVar91);
      auVar78 = vmulps_avx512vl(auVar38,auVar80);
      auVar38 = vsubps_avx(auVar83,auVar88);
      auVar79 = vmulps_avx512vl(auVar38,auVar80);
      auVar38 = vsubps_avx(auVar84,auVar83);
      auVar38 = vmulps_avx512vl(auVar38,auVar80);
      auVar77 = vminps_avx(auVar79,auVar38);
      auVar38 = vmaxps_avx(auVar79,auVar38);
      auVar77 = vminps_avx(auVar78,auVar77);
      auVar38 = vmaxps_avx(auVar78,auVar38);
      auVar78 = vshufpd_avx(auVar77,auVar77,3);
      auVar79 = vshufpd_avx(auVar38,auVar38,3);
      auVar77 = vminps_avx(auVar77,auVar78);
      auVar38 = vmaxps_avx(auVar38,auVar79);
      fVar215 = auVar85._0_4_;
      auVar188._0_4_ = auVar77._0_4_ * fVar215;
      auVar188._4_4_ = auVar77._4_4_ * fVar215;
      auVar188._8_4_ = auVar77._8_4_ * fVar215;
      auVar188._12_4_ = auVar77._12_4_ * fVar215;
      auVar180._0_4_ = fVar215 * auVar38._0_4_;
      auVar180._4_4_ = fVar215 * auVar38._4_4_;
      auVar180._8_4_ = fVar215 * auVar38._8_4_;
      auVar180._12_4_ = fVar215 * auVar38._12_4_;
      auVar87 = vdivss_avx512f(auVar92,ZEXT416((uint)(auVar81._0_4_ - auVar177._0_4_)));
      auVar38 = vshufpd_avx(auVar91,auVar91,3);
      auVar77 = vshufpd_avx(auVar88,auVar88,3);
      auVar78 = vshufpd_avx(auVar83,auVar83,3);
      auVar79 = vshufpd_avx(auVar84,auVar84,3);
      auVar38 = vsubps_avx(auVar38,auVar91);
      auVar85 = vsubps_avx(auVar77,auVar88);
      auVar91 = vsubps_avx(auVar78,auVar83);
      auVar79 = vsubps_avx(auVar79,auVar84);
      auVar77 = vminps_avx(auVar38,auVar85);
      auVar38 = vmaxps_avx(auVar38,auVar85);
      auVar78 = vminps_avx(auVar91,auVar79);
      auVar78 = vminps_avx(auVar77,auVar78);
      auVar77 = vmaxps_avx(auVar91,auVar79);
      auVar38 = vmaxps_avx(auVar38,auVar77);
      fVar215 = auVar87._0_4_;
      auVar220._0_4_ = fVar215 * auVar78._0_4_;
      auVar220._4_4_ = fVar215 * auVar78._4_4_;
      auVar220._8_4_ = fVar215 * auVar78._8_4_;
      auVar220._12_4_ = fVar215 * auVar78._12_4_;
      auVar205._0_4_ = fVar215 * auVar38._0_4_;
      auVar205._4_4_ = fVar215 * auVar38._4_4_;
      auVar205._8_4_ = fVar215 * auVar38._8_4_;
      auVar205._12_4_ = fVar215 * auVar38._12_4_;
      auVar79 = vinsertps_avx(auVar48,auVar177,0x10);
      auVar82 = vpermt2ps_avx512vl(auVar48,_DAT_01fb9f90,auVar81);
      auVar132._0_4_ = auVar79._0_4_ + auVar82._0_4_;
      auVar132._4_4_ = auVar79._4_4_ + auVar82._4_4_;
      auVar132._8_4_ = auVar79._8_4_ + auVar82._8_4_;
      auVar132._12_4_ = auVar79._12_4_ + auVar82._12_4_;
      auVar18._8_4_ = 0x3f000000;
      auVar18._0_8_ = 0x3f0000003f000000;
      auVar18._12_4_ = 0x3f000000;
      auVar84 = vmulps_avx512vl(auVar132,auVar18);
      auVar77 = vshufps_avx(auVar84,auVar84,0x54);
      uVar127 = auVar84._0_4_;
      auVar134._4_4_ = uVar127;
      auVar134._0_4_ = uVar127;
      auVar134._8_4_ = uVar127;
      auVar134._12_4_ = uVar127;
      auVar78 = vfmadd213ps_fma(auVar54,auVar134,auVar58);
      auVar85 = vfmadd213ps_fma(auVar52,auVar134,auVar57);
      auVar91 = vfmadd213ps_fma(auVar62,auVar134,auVar59);
      auVar38 = vsubps_avx(auVar85,auVar78);
      auVar78 = vfmadd213ps_fma(auVar38,auVar134,auVar78);
      auVar38 = vsubps_avx(auVar91,auVar85);
      auVar38 = vfmadd213ps_fma(auVar38,auVar134,auVar85);
      auVar38 = vsubps_avx(auVar38,auVar78);
      auVar78 = vfmadd231ps_fma(auVar78,auVar38,auVar134);
      auVar88 = vmulps_avx512vl(auVar38,auVar80);
      auVar228._8_8_ = auVar78._0_8_;
      auVar228._0_8_ = auVar78._0_8_;
      auVar38 = vshufpd_avx(auVar78,auVar78,3);
      auVar78 = vshufps_avx(auVar84,auVar84,0x55);
      auVar85 = vsubps_avx(auVar38,auVar228);
      auVar91 = vfmadd231ps_fma(auVar228,auVar78,auVar85);
      auVar241._8_8_ = auVar88._0_8_;
      auVar241._0_8_ = auVar88._0_8_;
      auVar38 = vshufpd_avx(auVar88,auVar88,3);
      auVar38 = vsubps_avx512vl(auVar38,auVar241);
      auVar38 = vfmadd213ps_avx512vl(auVar38,auVar78,auVar241);
      auVar135._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
      auVar135._8_4_ = auVar85._8_4_ ^ 0x80000000;
      auVar135._12_4_ = auVar85._12_4_ ^ 0x80000000;
      auVar78 = vmovshdup_avx512vl(auVar38);
      auVar242._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
      auVar242._8_4_ = auVar78._8_4_ ^ 0x80000000;
      auVar242._12_4_ = auVar78._12_4_ ^ 0x80000000;
      auVar88 = vmovshdup_avx512vl(auVar85);
      auVar83 = vpermt2ps_avx512vl(auVar242,ZEXT416(5),auVar85);
      auVar78 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar78._0_4_ * auVar85._0_4_)),auVar38,auVar88);
      auVar85 = vpermt2ps_avx512vl(auVar38,SUB6416(ZEXT464(4),0),auVar135);
      auVar159._0_4_ = auVar78._0_4_;
      auVar159._4_4_ = auVar159._0_4_;
      auVar159._8_4_ = auVar159._0_4_;
      auVar159._12_4_ = auVar159._0_4_;
      auVar38 = vdivps_avx(auVar83,auVar159);
      auVar89 = vdivps_avx512vl(auVar85,auVar159);
      fVar215 = auVar91._0_4_;
      auVar78 = vshufps_avx(auVar91,auVar91,0x55);
      auVar229._0_4_ = fVar215 * auVar38._0_4_ + auVar78._0_4_ * auVar89._0_4_;
      auVar229._4_4_ = fVar215 * auVar38._4_4_ + auVar78._4_4_ * auVar89._4_4_;
      auVar229._8_4_ = fVar215 * auVar38._8_4_ + auVar78._8_4_ * auVar89._8_4_;
      auVar229._12_4_ = fVar215 * auVar38._12_4_ + auVar78._12_4_ * auVar89._12_4_;
      auVar87 = vsubps_avx(auVar77,auVar229);
      auVar78 = vmovshdup_avx(auVar38);
      auVar77 = vinsertps_avx(auVar188,auVar220,0x1c);
      auVar243._0_4_ = auVar78._0_4_ * auVar77._0_4_;
      auVar243._4_4_ = auVar78._4_4_ * auVar77._4_4_;
      auVar243._8_4_ = auVar78._8_4_ * auVar77._8_4_;
      auVar243._12_4_ = auVar78._12_4_ * auVar77._12_4_;
      auVar86 = vinsertps_avx512f(auVar180,auVar205,0x1c);
      auVar78 = vmulps_avx512vl(auVar78,auVar86);
      auVar83 = vminps_avx512vl(auVar243,auVar78);
      auVar91 = vmaxps_avx(auVar78,auVar243);
      auVar88 = vmovshdup_avx(auVar89);
      auVar78 = vinsertps_avx(auVar220,auVar188,0x4c);
      auVar221._0_4_ = auVar88._0_4_ * auVar78._0_4_;
      auVar221._4_4_ = auVar88._4_4_ * auVar78._4_4_;
      auVar221._8_4_ = auVar88._8_4_ * auVar78._8_4_;
      auVar221._12_4_ = auVar88._12_4_ * auVar78._12_4_;
      auVar85 = vinsertps_avx(auVar205,auVar180,0x4c);
      auVar206._0_4_ = auVar88._0_4_ * auVar85._0_4_;
      auVar206._4_4_ = auVar88._4_4_ * auVar85._4_4_;
      auVar206._8_4_ = auVar88._8_4_ * auVar85._8_4_;
      auVar206._12_4_ = auVar88._12_4_ * auVar85._12_4_;
      auVar88 = vminps_avx(auVar221,auVar206);
      auVar83 = vaddps_avx512vl(auVar83,auVar88);
      auVar88 = vmaxps_avx(auVar206,auVar221);
      auVar207._0_4_ = auVar91._0_4_ + auVar88._0_4_;
      auVar207._4_4_ = auVar91._4_4_ + auVar88._4_4_;
      auVar207._8_4_ = auVar91._8_4_ + auVar88._8_4_;
      auVar207._12_4_ = auVar91._12_4_ + auVar88._12_4_;
      auVar222._8_8_ = 0x3f80000000000000;
      auVar222._0_8_ = 0x3f80000000000000;
      auVar91 = vsubps_avx(auVar222,auVar207);
      auVar88 = vsubps_avx(auVar222,auVar83);
      auVar83 = vsubps_avx(auVar79,auVar84);
      auVar84 = vsubps_avx(auVar82,auVar84);
      fVar212 = auVar83._0_4_;
      auVar244._0_4_ = fVar212 * auVar91._0_4_;
      fVar213 = auVar83._4_4_;
      auVar244._4_4_ = fVar213 * auVar91._4_4_;
      fVar214 = auVar83._8_4_;
      auVar244._8_4_ = fVar214 * auVar91._8_4_;
      fVar144 = auVar83._12_4_;
      auVar244._12_4_ = fVar144 * auVar91._12_4_;
      auVar90 = vbroadcastss_avx512vl(auVar38);
      auVar77 = vmulps_avx512vl(auVar90,auVar77);
      auVar86 = vmulps_avx512vl(auVar90,auVar86);
      auVar90 = vminps_avx512vl(auVar77,auVar86);
      auVar86 = vmaxps_avx512vl(auVar86,auVar77);
      auVar77 = vbroadcastss_avx512vl(auVar89);
      auVar78 = vmulps_avx512vl(auVar77,auVar78);
      auVar77 = vmulps_avx512vl(auVar77,auVar85);
      auVar85 = vminps_avx512vl(auVar78,auVar77);
      auVar85 = vaddps_avx512vl(auVar90,auVar85);
      auVar83 = vmulps_avx512vl(auVar83,auVar88);
      fVar215 = auVar84._0_4_;
      auVar208._0_4_ = fVar215 * auVar91._0_4_;
      fVar201 = auVar84._4_4_;
      auVar208._4_4_ = fVar201 * auVar91._4_4_;
      fVar210 = auVar84._8_4_;
      auVar208._8_4_ = fVar210 * auVar91._8_4_;
      fVar211 = auVar84._12_4_;
      auVar208._12_4_ = fVar211 * auVar91._12_4_;
      auVar223._0_4_ = fVar215 * auVar88._0_4_;
      auVar223._4_4_ = fVar201 * auVar88._4_4_;
      auVar223._8_4_ = fVar210 * auVar88._8_4_;
      auVar223._12_4_ = fVar211 * auVar88._12_4_;
      auVar77 = vmaxps_avx(auVar77,auVar78);
      auVar181._0_4_ = auVar86._0_4_ + auVar77._0_4_;
      auVar181._4_4_ = auVar86._4_4_ + auVar77._4_4_;
      auVar181._8_4_ = auVar86._8_4_ + auVar77._8_4_;
      auVar181._12_4_ = auVar86._12_4_ + auVar77._12_4_;
      auVar189._8_8_ = 0x3f800000;
      auVar189._0_8_ = 0x3f800000;
      auVar77 = vsubps_avx(auVar189,auVar181);
      auVar78 = vsubps_avx512vl(auVar189,auVar85);
      auVar237._0_4_ = fVar212 * auVar77._0_4_;
      auVar237._4_4_ = fVar213 * auVar77._4_4_;
      auVar237._8_4_ = fVar214 * auVar77._8_4_;
      auVar237._12_4_ = fVar144 * auVar77._12_4_;
      auVar230._0_4_ = fVar212 * auVar78._0_4_;
      auVar230._4_4_ = fVar213 * auVar78._4_4_;
      auVar230._8_4_ = fVar214 * auVar78._8_4_;
      auVar230._12_4_ = fVar144 * auVar78._12_4_;
      auVar182._0_4_ = fVar215 * auVar77._0_4_;
      auVar182._4_4_ = fVar201 * auVar77._4_4_;
      auVar182._8_4_ = fVar210 * auVar77._8_4_;
      auVar182._12_4_ = fVar211 * auVar77._12_4_;
      auVar190._0_4_ = fVar215 * auVar78._0_4_;
      auVar190._4_4_ = fVar201 * auVar78._4_4_;
      auVar190._8_4_ = fVar210 * auVar78._8_4_;
      auVar190._12_4_ = fVar211 * auVar78._12_4_;
      auVar77 = vminps_avx(auVar237,auVar230);
      auVar78 = vminps_avx512vl(auVar182,auVar190);
      auVar85 = vminps_avx512vl(auVar77,auVar78);
      auVar77 = vmaxps_avx(auVar230,auVar237);
      auVar78 = vmaxps_avx(auVar190,auVar182);
      auVar78 = vmaxps_avx(auVar78,auVar77);
      auVar91 = vminps_avx512vl(auVar244,auVar83);
      auVar77 = vminps_avx(auVar208,auVar223);
      auVar77 = vminps_avx(auVar91,auVar77);
      auVar77 = vhaddps_avx(auVar85,auVar77);
      auVar91 = vmaxps_avx512vl(auVar83,auVar244);
      auVar85 = vmaxps_avx(auVar223,auVar208);
      auVar85 = vmaxps_avx(auVar85,auVar91);
      auVar78 = vhaddps_avx(auVar78,auVar85);
      auVar77 = vshufps_avx(auVar77,auVar77,0xe8);
      auVar78 = vshufps_avx(auVar78,auVar78,0xe8);
      auVar183._0_4_ = auVar77._0_4_ + auVar87._0_4_;
      auVar183._4_4_ = auVar77._4_4_ + auVar87._4_4_;
      auVar183._8_4_ = auVar77._8_4_ + auVar87._8_4_;
      auVar183._12_4_ = auVar77._12_4_ + auVar87._12_4_;
      auVar191._0_4_ = auVar78._0_4_ + auVar87._0_4_;
      auVar191._4_4_ = auVar78._4_4_ + auVar87._4_4_;
      auVar191._8_4_ = auVar78._8_4_ + auVar87._8_4_;
      auVar191._12_4_ = auVar78._12_4_ + auVar87._12_4_;
      auVar77 = vmaxps_avx(auVar79,auVar183);
      auVar78 = vminps_avx(auVar191,auVar82);
      uVar35 = vcmpps_avx512vl(auVar78,auVar77,1);
    } while ((uVar35 & 3) != 0);
    uVar35 = vcmpps_avx512vl(auVar191,auVar82,1);
    uVar14 = vcmpps_avx512vl(auVar48,auVar183,1);
    if (((ushort)uVar14 & (ushort)uVar35 & 1) == 0) {
      bVar22 = 0;
    }
    else {
      auVar77 = vmovshdup_avx(auVar183);
      bVar22 = auVar177._0_4_ < auVar77._0_4_ & (byte)(uVar35 >> 1) & 0x7f;
    }
    p03.field_0.i[0] = auVar44._0_4_;
    p03.field_0.i[1] = auVar44._4_4_;
    p03.field_0.i[2] = auVar44._8_4_;
    p03.field_0.i[3] = auVar44._12_4_;
    if (((3 < (uint)uVar25 || uVar7 != 0 && !bVar33) | bVar22) == 1) {
      lVar29 = 0xc9;
      do {
        lVar29 = lVar29 + -1;
        if (lVar29 == 0) goto LAB_018bd09f;
        auVar48 = vsubss_avx512f(auVar92,auVar87);
        fVar210 = auVar48._0_4_;
        fVar215 = fVar210 * fVar210 * fVar210;
        auVar48 = vmulss_avx512f(auVar87,ZEXT416(0x40400000));
        fVar201 = auVar48._0_4_ * fVar210 * fVar210;
        fVar211 = auVar87._0_4_;
        auVar48 = vmulss_avx512f(ZEXT416((uint)(fVar211 * fVar211)),ZEXT416(0x40400000));
        fVar210 = fVar210 * auVar48._0_4_;
        auVar148._4_4_ = fVar215;
        auVar148._0_4_ = fVar215;
        auVar148._8_4_ = fVar215;
        auVar148._12_4_ = fVar215;
        auVar140._4_4_ = fVar201;
        auVar140._0_4_ = fVar201;
        auVar140._8_4_ = fVar201;
        auVar140._12_4_ = fVar201;
        auVar129._4_4_ = fVar210;
        auVar129._0_4_ = fVar210;
        auVar129._8_4_ = fVar210;
        auVar129._12_4_ = fVar210;
        fVar211 = fVar211 * fVar211 * fVar211;
        auVar168._0_4_ = p03.field_0.v[0] * fVar211;
        auVar168._4_4_ = p03.field_0.v[1] * fVar211;
        auVar168._8_4_ = p03.field_0.v[2] * fVar211;
        auVar168._12_4_ = p03.field_0.v[3] * fVar211;
        auVar48 = vfmadd231ps_fma(auVar168,auVar59,auVar129);
        auVar48 = vfmadd231ps_fma(auVar48,auVar57,auVar140);
        auVar48 = vfmadd231ps_fma(auVar48,auVar58,auVar148);
        auVar130._8_8_ = auVar48._0_8_;
        auVar130._0_8_ = auVar48._0_8_;
        auVar48 = vshufpd_avx(auVar48,auVar48,3);
        auVar77 = vshufps_avx(auVar87,auVar87,0x55);
        auVar48 = vsubps_avx(auVar48,auVar130);
        auVar77 = vfmadd213ps_fma(auVar48,auVar77,auVar130);
        fVar215 = auVar77._0_4_;
        auVar48 = vshufps_avx(auVar77,auVar77,0x55);
        auVar131._0_4_ = auVar38._0_4_ * fVar215 + auVar89._0_4_ * auVar48._0_4_;
        auVar131._4_4_ = auVar38._4_4_ * fVar215 + auVar89._4_4_ * auVar48._4_4_;
        auVar131._8_4_ = auVar38._8_4_ * fVar215 + auVar89._8_4_ * auVar48._8_4_;
        auVar131._12_4_ = auVar38._12_4_ * fVar215 + auVar89._12_4_ * auVar48._12_4_;
        auVar87 = vsubps_avx(auVar87,auVar131);
        auVar48 = vandps_avx512vl(auVar77,auVar250._0_16_);
        auVar77 = vprolq_avx512vl(auVar48,0x20);
        auVar48 = vmaxss_avx(auVar77,auVar48);
        bVar33 = auVar48._0_4_ <= fVar162;
      } while (fVar162 <= auVar48._0_4_);
      auVar48 = vucomiss_avx512f(auVar145);
      if (bVar33) {
        auVar38 = vucomiss_avx512f(auVar48);
        auVar251 = ZEXT1664(auVar38);
        if (bVar33) {
          vmovshdup_avx(auVar48);
          auVar38 = vucomiss_avx512f(auVar145);
          if (bVar33) {
            auVar77 = vucomiss_avx512f(auVar38);
            auVar251 = ZEXT1664(auVar77);
            if (bVar33) {
              auVar78 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar87 = vinsertps_avx(auVar78,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar78 = vdpps_avx(auVar87,auVar64,0x7f);
              auVar79 = vdpps_avx(auVar87,auVar65,0x7f);
              auVar85 = vdpps_avx(auVar87,auVar66,0x7f);
              auVar91 = vdpps_avx(auVar87,auVar42,0x7f);
              auVar88 = vdpps_avx(auVar87,auVar67,0x7f);
              auVar83 = vdpps_avx(auVar87,auVar68,0x7f);
              auVar84 = vdpps_avx(auVar87,auVar69,0x7f);
              auVar87 = vdpps_avx(auVar87,auVar43,0x7f);
              auVar92 = vsubss_avx512f(auVar77,auVar38);
              fVar211 = auVar38._0_4_;
              auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * auVar88._0_4_)),auVar92,auVar78);
              auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ * fVar211)),auVar92,auVar79);
              auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar84._0_4_ * fVar211)),auVar92,auVar85);
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * auVar87._0_4_)),auVar92,auVar91);
              auVar77 = vsubss_avx512f(auVar77,auVar48);
              auVar192._0_4_ = auVar77._0_4_;
              fVar215 = auVar192._0_4_ * auVar192._0_4_ * auVar192._0_4_;
              auVar77 = vmulss_avx512f(auVar48,ZEXT416(0x40400000));
              fVar201 = auVar77._0_4_ * auVar192._0_4_ * auVar192._0_4_;
              local_b8 = auVar48._0_4_;
              auVar149._0_4_ = local_b8 * local_b8;
              auVar149._4_4_ = auVar48._4_4_ * auVar48._4_4_;
              auVar149._8_4_ = auVar48._8_4_ * auVar48._8_4_;
              auVar149._12_4_ = auVar48._12_4_ * auVar48._12_4_;
              auVar77 = vmulss_avx512f(auVar149,ZEXT416(0x40400000));
              fVar210 = auVar192._0_4_ * auVar77._0_4_;
              fVar213 = local_b8 * auVar149._0_4_;
              auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * auVar85._0_4_)),
                                        ZEXT416((uint)fVar210),auVar79);
              auVar77 = vfmadd231ss_fma(auVar77,ZEXT416((uint)fVar201),auVar78);
              auVar38 = vfmadd231ss_fma(auVar77,ZEXT416((uint)fVar215),auVar38);
              fVar212 = auVar38._0_4_;
              if ((fVar163 <= fVar212) &&
                 (fVar214 = *(float *)(ray + k * 4 + 0x80), fVar212 <= fVar214)) {
                local_a8 = vshufps_avx(auVar48,auVar48,0x55);
                auVar184._8_4_ = 0x3f800000;
                auVar184._0_8_ = 0x3f8000003f800000;
                auVar184._12_4_ = 0x3f800000;
                auVar48 = vsubps_avx(auVar184,local_a8);
                local_268 = auVar63._0_4_;
                fStack_264 = auVar63._4_4_;
                fStack_260 = auVar63._8_4_;
                fStack_25c = auVar63._12_4_;
                fVar144 = local_a8._0_4_;
                auVar197._0_4_ = fVar144 * local_268;
                fVar151 = local_a8._4_4_;
                auVar197._4_4_ = fVar151 * fStack_264;
                fVar152 = local_a8._8_4_;
                auVar197._8_4_ = fVar152 * fStack_260;
                fVar153 = local_a8._12_4_;
                auVar197._12_4_ = fVar153 * fStack_25c;
                local_278 = auVar40._0_4_;
                fStack_274 = auVar40._4_4_;
                fStack_270 = auVar40._8_4_;
                fStack_26c = auVar40._12_4_;
                auVar209._0_4_ = fVar144 * local_278;
                auVar209._4_4_ = fVar151 * fStack_274;
                auVar209._8_4_ = fVar152 * fStack_270;
                auVar209._12_4_ = fVar153 * fStack_26c;
                local_288 = auVar41._0_4_;
                fStack_284 = auVar41._4_4_;
                fStack_280 = auVar41._8_4_;
                fStack_27c = auVar41._12_4_;
                auVar224._0_4_ = fVar144 * local_288;
                auVar224._4_4_ = fVar151 * fStack_284;
                auVar224._8_4_ = fVar152 * fStack_280;
                auVar224._12_4_ = fVar153 * fStack_27c;
                local_298 = auVar46._0_4_;
                fStack_294 = auVar46._4_4_;
                fStack_290 = auVar46._8_4_;
                fStack_28c = auVar46._12_4_;
                auVar231._0_4_ = fVar144 * local_298;
                auVar231._4_4_ = fVar151 * fStack_294;
                auVar231._8_4_ = fVar152 * fStack_290;
                auVar231._12_4_ = fVar153 * fStack_28c;
                auVar38 = vfmadd231ps_fma(auVar197,auVar48,auVar56);
                auVar77 = vfmadd231ps_fma(auVar209,auVar48,auVar60);
                auVar78 = vfmadd231ps_fma(auVar224,auVar48,auVar61);
                auVar79 = vfmadd231ps_fma(auVar231,auVar48,auVar45);
                auVar48 = vsubps_avx(auVar77,auVar38);
                auVar38 = vsubps_avx(auVar78,auVar77);
                auVar77 = vsubps_avx(auVar79,auVar78);
                auVar232._0_4_ = local_b8 * auVar38._0_4_;
                auVar232._4_4_ = local_b8 * auVar38._4_4_;
                auVar232._8_4_ = local_b8 * auVar38._8_4_;
                auVar232._12_4_ = local_b8 * auVar38._12_4_;
                auVar192._4_4_ = auVar192._0_4_;
                auVar192._8_4_ = auVar192._0_4_;
                auVar192._12_4_ = auVar192._0_4_;
                auVar48 = vfmadd231ps_fma(auVar232,auVar192,auVar48);
                auVar198._0_4_ = local_b8 * auVar77._0_4_;
                auVar198._4_4_ = local_b8 * auVar77._4_4_;
                auVar198._8_4_ = local_b8 * auVar77._8_4_;
                auVar198._12_4_ = local_b8 * auVar77._12_4_;
                auVar38 = vfmadd231ps_fma(auVar198,auVar192,auVar38);
                auVar199._0_4_ = local_b8 * auVar38._0_4_;
                auVar199._4_4_ = local_b8 * auVar38._4_4_;
                auVar199._8_4_ = local_b8 * auVar38._8_4_;
                auVar199._12_4_ = local_b8 * auVar38._12_4_;
                auVar48 = vfmadd231ps_fma(auVar199,auVar192,auVar48);
                auVar48 = vmulps_avx512vl(auVar48,auVar80);
                pGVar8 = (context->scene->geometries).items[uVar24].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_2d8 = auVar47._0_4_;
                  fStack_2d4 = auVar47._4_4_;
                  fStack_2d0 = auVar47._8_4_;
                  fStack_2cc = auVar47._12_4_;
                  auVar175._0_4_ = fVar213 * local_2d8;
                  auVar175._4_4_ = fVar213 * fStack_2d4;
                  auVar175._8_4_ = fVar213 * fStack_2d0;
                  auVar175._12_4_ = fVar213 * fStack_2cc;
                  auVar169._4_4_ = fVar210;
                  auVar169._0_4_ = fVar210;
                  auVar169._8_4_ = fVar210;
                  auVar169._12_4_ = fVar210;
                  auVar38 = vfmadd132ps_fma(auVar169,auVar175,auVar74);
                  auVar160._4_4_ = fVar201;
                  auVar160._0_4_ = fVar201;
                  auVar160._8_4_ = fVar201;
                  auVar160._12_4_ = fVar201;
                  auVar38 = vfmadd132ps_fma(auVar160,auVar38,auVar73);
                  auVar141._4_4_ = fVar215;
                  auVar141._0_4_ = fVar215;
                  auVar141._8_4_ = fVar215;
                  auVar141._12_4_ = fVar215;
                  auVar77 = vfmadd132ps_fma(auVar141,auVar38,auVar72);
                  auVar38 = vshufps_avx(auVar77,auVar77,0xc9);
                  auVar80 = vshufps_avx(auVar48,auVar48,0xc9);
                  auVar142._0_4_ = auVar77._0_4_ * auVar80._0_4_;
                  auVar142._4_4_ = auVar77._4_4_ * auVar80._4_4_;
                  auVar142._8_4_ = auVar77._8_4_ * auVar80._8_4_;
                  auVar142._12_4_ = auVar77._12_4_ * auVar80._12_4_;
                  auVar48 = vfmsub231ps_fma(auVar142,auVar48,auVar38);
                  local_c8 = auVar48._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar212;
                    uVar127 = vextractps_avx(auVar48,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar127;
                    uVar127 = vextractps_avx(auVar48,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar127;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = local_c8;
                    *(float *)(ray + k * 4 + 0xf0) = local_b8;
                    *(float *)(ray + k * 4 + 0x100) = fVar211;
                    *(uint *)(ray + k * 4 + 0x110) = uVar6;
                    *(int *)(ray + k * 4 + 0x120) = (int)uVar24;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_018bd09f;
                  }
                  auVar38 = vshufps_avx(auVar48,auVar48,0x55);
                  local_d8 = vshufps_avx(auVar48,auVar48,0xaa);
                  local_e8[0] = (RTCHitN)auVar38[0];
                  local_e8[1] = (RTCHitN)auVar38[1];
                  local_e8[2] = (RTCHitN)auVar38[2];
                  local_e8[3] = (RTCHitN)auVar38[3];
                  local_e8[4] = (RTCHitN)auVar38[4];
                  local_e8[5] = (RTCHitN)auVar38[5];
                  local_e8[6] = (RTCHitN)auVar38[6];
                  local_e8[7] = (RTCHitN)auVar38[7];
                  local_e8[8] = (RTCHitN)auVar38[8];
                  local_e8[9] = (RTCHitN)auVar38[9];
                  local_e8[10] = (RTCHitN)auVar38[10];
                  local_e8[0xb] = (RTCHitN)auVar38[0xb];
                  local_e8[0xc] = (RTCHitN)auVar38[0xc];
                  local_e8[0xd] = (RTCHitN)auVar38[0xd];
                  local_e8[0xe] = (RTCHitN)auVar38[0xe];
                  local_e8[0xf] = (RTCHitN)auVar38[0xf];
                  uStack_c4 = local_c8;
                  uStack_c0 = local_c8;
                  uStack_bc = local_c8;
                  fStack_b4 = local_b8;
                  fStack_b0 = local_b8;
                  fStack_ac = local_b8;
                  local_308 = auVar76._0_8_;
                  uStack_300 = auVar76._8_8_;
                  local_98 = local_308;
                  uStack_90 = uStack_300;
                  local_88 = auVar75;
                  vpcmpeqd_avx2(ZEXT1632(auVar75),ZEXT1632(auVar75));
                  uStack_74 = context->user->instID[0];
                  local_78 = uStack_74;
                  uStack_70 = uStack_74;
                  uStack_6c = uStack_74;
                  uStack_68 = context->user->instPrimID[0];
                  uStack_64 = uStack_68;
                  uStack_60 = uStack_68;
                  uStack_5c = uStack_68;
                  *(float *)(ray + k * 4 + 0x80) = fVar212;
                  args.valid = (int *)local_378;
                  args.geometryUserPtr = pGVar8->userPtr;
                  args.context = context->user;
                  args.hit = local_e8;
                  args.N = 4;
                  local_378 = auVar51;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_368 = uVar24;
                    (*pGVar8->intersectionFilterN)(&args);
                    auVar248 = ZEXT3264(_DAT_01fb9fe0);
                    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar247 = ZEXT1664(auVar48);
                    auVar112 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar246 = ZEXT3264(auVar112);
                    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar252 = ZEXT1664(auVar48);
                    auVar251 = ZEXT464(0x3f800000);
                    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar249 = ZEXT1664(auVar48);
                    auVar48 = vxorps_avx512vl(auVar145,auVar145);
                    auVar245 = ZEXT1664(auVar48);
                    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar250 = ZEXT1664(auVar48);
                    uVar24 = local_368;
                  }
                  auVar48 = auVar245._0_16_;
                  uVar35 = vptestmd_avx512vl(local_378,local_378);
                  if ((uVar35 & 0xf) != 0) {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var13)(&args);
                      auVar248 = ZEXT3264(_DAT_01fb9fe0);
                      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar247 = ZEXT1664(auVar38);
                      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar246 = ZEXT3264(auVar112);
                      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar252 = ZEXT1664(auVar38);
                      auVar251 = ZEXT464(0x3f800000);
                      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar249 = ZEXT1664(auVar38);
                      auVar48 = vxorps_avx512vl(auVar48,auVar48);
                      auVar245 = ZEXT1664(auVar48);
                      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar250 = ZEXT1664(auVar48);
                    }
                    uVar35 = vptestmd_avx512vl(local_378,local_378);
                    uVar35 = uVar35 & 0xf;
                    bVar22 = (byte)uVar35;
                    if (bVar22 != 0) {
                      iVar126 = *(int *)(args.hit + 4);
                      iVar20 = *(int *)(args.hit + 8);
                      iVar21 = *(int *)(args.hit + 0xc);
                      bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar34 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar31 = SUB81(uVar35 >> 3,0);
                      *(uint *)(args.ray + 0xc0) =
                           (uint)(bVar22 & 1) * *(int *)args.hit |
                           (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0xc0);
                      *(uint *)(args.ray + 0xc4) =
                           (uint)bVar33 * iVar126 | (uint)!bVar33 * *(int *)(args.ray + 0xc4);
                      *(uint *)(args.ray + 200) =
                           (uint)bVar34 * iVar20 | (uint)!bVar34 * *(int *)(args.ray + 200);
                      *(uint *)(args.ray + 0xcc) =
                           (uint)bVar31 * iVar21 | (uint)!bVar31 * *(int *)(args.ray + 0xcc);
                      iVar126 = *(int *)(args.hit + 0x14);
                      iVar20 = *(int *)(args.hit + 0x18);
                      iVar21 = *(int *)(args.hit + 0x1c);
                      bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar34 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar31 = SUB81(uVar35 >> 3,0);
                      *(uint *)(args.ray + 0xd0) =
                           (uint)(bVar22 & 1) * *(int *)(args.hit + 0x10) |
                           (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0xd0);
                      *(uint *)(args.ray + 0xd4) =
                           (uint)bVar33 * iVar126 | (uint)!bVar33 * *(int *)(args.ray + 0xd4);
                      *(uint *)(args.ray + 0xd8) =
                           (uint)bVar34 * iVar20 | (uint)!bVar34 * *(int *)(args.ray + 0xd8);
                      *(uint *)(args.ray + 0xdc) =
                           (uint)bVar31 * iVar21 | (uint)!bVar31 * *(int *)(args.ray + 0xdc);
                      iVar126 = *(int *)(args.hit + 0x24);
                      iVar20 = *(int *)(args.hit + 0x28);
                      iVar21 = *(int *)(args.hit + 0x2c);
                      bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar34 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar31 = SUB81(uVar35 >> 3,0);
                      *(uint *)(args.ray + 0xe0) =
                           (uint)(bVar22 & 1) * *(int *)(args.hit + 0x20) |
                           (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0xe0);
                      *(uint *)(args.ray + 0xe4) =
                           (uint)bVar33 * iVar126 | (uint)!bVar33 * *(int *)(args.ray + 0xe4);
                      *(uint *)(args.ray + 0xe8) =
                           (uint)bVar34 * iVar20 | (uint)!bVar34 * *(int *)(args.ray + 0xe8);
                      *(uint *)(args.ray + 0xec) =
                           (uint)bVar31 * iVar21 | (uint)!bVar31 * *(int *)(args.ray + 0xec);
                      iVar126 = *(int *)(args.hit + 0x34);
                      iVar20 = *(int *)(args.hit + 0x38);
                      iVar21 = *(int *)(args.hit + 0x3c);
                      bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar34 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar31 = SUB81(uVar35 >> 3,0);
                      *(uint *)(args.ray + 0xf0) =
                           (uint)(bVar22 & 1) * *(int *)(args.hit + 0x30) |
                           (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0xf0);
                      *(uint *)(args.ray + 0xf4) =
                           (uint)bVar33 * iVar126 | (uint)!bVar33 * *(int *)(args.ray + 0xf4);
                      *(uint *)(args.ray + 0xf8) =
                           (uint)bVar34 * iVar20 | (uint)!bVar34 * *(int *)(args.ray + 0xf8);
                      *(uint *)(args.ray + 0xfc) =
                           (uint)bVar31 * iVar21 | (uint)!bVar31 * *(int *)(args.ray + 0xfc);
                      iVar126 = *(int *)(args.hit + 0x44);
                      iVar20 = *(int *)(args.hit + 0x48);
                      iVar21 = *(int *)(args.hit + 0x4c);
                      bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar34 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar31 = SUB81(uVar35 >> 3,0);
                      *(uint *)(args.ray + 0x100) =
                           (uint)(bVar22 & 1) * *(int *)(args.hit + 0x40) |
                           (uint)!(bool)(bVar22 & 1) * *(uint *)(args.ray + 0x100);
                      *(uint *)(args.ray + 0x104) =
                           (uint)bVar33 * iVar126 | (uint)!bVar33 * *(int *)(args.ray + 0x104);
                      *(uint *)(args.ray + 0x108) =
                           (uint)bVar34 * iVar20 | (uint)!bVar34 * *(int *)(args.ray + 0x108);
                      *(uint *)(args.ray + 0x10c) =
                           (uint)bVar31 * iVar21 | (uint)!bVar31 * *(int *)(args.ray + 0x10c);
                      auVar48 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar48;
                      auVar48 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar48;
                      auVar48 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar48;
                      auVar48 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar48;
                      goto LAB_018bd09f;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar214;
                }
              }
            }
          }
        }
      }
      goto LAB_018bd09f;
    }
    auVar38 = vinsertps_avx(auVar177,auVar81,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }